

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  int iVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  ulong uVar74;
  RayK<8> *pRVar75;
  byte bVar76;
  ulong uVar77;
  long lVar78;
  ulong uVar79;
  bool bVar80;
  uint uVar81;
  Geometry *geometry;
  long lVar82;
  ulong uVar83;
  float fVar84;
  float fVar85;
  float fVar132;
  float fVar134;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar138;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined4 uVar139;
  undefined8 uVar140;
  vint4 bi_2;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar151;
  vint4 bi_1;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  vint4 bi;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar161;
  float fVar167;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  float fVar168;
  float fVar169;
  float fVar178;
  float fVar179;
  vint4 ai_2;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar180;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  vint4 ai_1;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  vint4 ai;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [64];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  bool local_7d9;
  RTCFilterFunctionNArguments local_7a0;
  undefined1 local_770 [8];
  float fStack_768;
  float fStack_764;
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined8 uStack_758;
  undefined1 local_750 [16];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float local_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  LinearSpace3fa *local_670;
  Primitive *local_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined4 local_3c0;
  int local_3bc;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  byte local_370;
  float local_360 [4];
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar6 = prim[1];
  uVar74 = (ulong)(byte)PVar6;
  lVar26 = uVar74 * 0x25;
  fVar169 = *(float *)(prim + lVar26 + 0x12);
  auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar90 = vsubps_avx(auVar90,*(undefined1 (*) [16])(prim + lVar26 + 6));
  auVar162._0_4_ = fVar169 * auVar90._0_4_;
  auVar162._4_4_ = fVar169 * auVar90._4_4_;
  auVar162._8_4_ = fVar169 * auVar90._8_4_;
  auVar162._12_4_ = fVar169 * auVar90._12_4_;
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 4 + 6)));
  auVar141._0_4_ = fVar169 * auVar89._0_4_;
  auVar141._4_4_ = fVar169 * auVar89._4_4_;
  auVar141._8_4_ = fVar169 * auVar89._8_4_;
  auVar141._12_4_ = fVar169 * auVar89._12_4_;
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 5 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 6 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0xf + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar74 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x1a + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x1b + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x1c + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar181._4_4_ = auVar141._0_4_;
  auVar181._0_4_ = auVar141._0_4_;
  auVar181._8_4_ = auVar141._0_4_;
  auVar181._12_4_ = auVar141._0_4_;
  auVar92 = vshufps_avx(auVar141,auVar141,0x55);
  auVar93 = vshufps_avx(auVar141,auVar141,0xaa);
  fVar169 = auVar93._0_4_;
  auVar156._0_4_ = fVar169 * auVar91._0_4_;
  fVar151 = auVar93._4_4_;
  auVar156._4_4_ = fVar151 * auVar91._4_4_;
  fVar168 = auVar93._8_4_;
  auVar156._8_4_ = fVar168 * auVar91._8_4_;
  fVar178 = auVar93._12_4_;
  auVar156._12_4_ = fVar178 * auVar91._12_4_;
  auVar152._0_4_ = auVar21._0_4_ * fVar169;
  auVar152._4_4_ = auVar21._4_4_ * fVar151;
  auVar152._8_4_ = auVar21._8_4_ * fVar168;
  auVar152._12_4_ = auVar21._12_4_ * fVar178;
  auVar142._0_4_ = auVar24._0_4_ * fVar169;
  auVar142._4_4_ = auVar24._4_4_ * fVar151;
  auVar142._8_4_ = auVar24._8_4_ * fVar168;
  auVar142._12_4_ = auVar24._12_4_ * fVar178;
  auVar93 = vfmadd231ps_fma(auVar156,auVar92,auVar89);
  auVar28 = vfmadd231ps_fma(auVar152,auVar92,auVar20);
  auVar92 = vfmadd231ps_fma(auVar142,auVar23,auVar92);
  auVar94 = vfmadd231ps_fma(auVar93,auVar181,auVar90);
  auVar28 = vfmadd231ps_fma(auVar28,auVar181,auVar19);
  auVar29 = vfmadd231ps_fma(auVar92,auVar22,auVar181);
  auVar203._4_4_ = auVar162._0_4_;
  auVar203._0_4_ = auVar162._0_4_;
  auVar203._8_4_ = auVar162._0_4_;
  auVar203._12_4_ = auVar162._0_4_;
  auVar92 = vshufps_avx(auVar162,auVar162,0x55);
  auVar93 = vshufps_avx(auVar162,auVar162,0xaa);
  fVar169 = auVar93._0_4_;
  auVar182._0_4_ = fVar169 * auVar91._0_4_;
  fVar151 = auVar93._4_4_;
  auVar182._4_4_ = fVar151 * auVar91._4_4_;
  fVar168 = auVar93._8_4_;
  auVar182._8_4_ = fVar168 * auVar91._8_4_;
  fVar178 = auVar93._12_4_;
  auVar182._12_4_ = fVar178 * auVar91._12_4_;
  auVar170._0_4_ = auVar21._0_4_ * fVar169;
  auVar170._4_4_ = auVar21._4_4_ * fVar151;
  auVar170._8_4_ = auVar21._8_4_ * fVar168;
  auVar170._12_4_ = auVar21._12_4_ * fVar178;
  auVar163._0_4_ = auVar24._0_4_ * fVar169;
  auVar163._4_4_ = auVar24._4_4_ * fVar151;
  auVar163._8_4_ = auVar24._8_4_ * fVar168;
  auVar163._12_4_ = auVar24._12_4_ * fVar178;
  auVar89 = vfmadd231ps_fma(auVar182,auVar92,auVar89);
  auVar91 = vfmadd231ps_fma(auVar170,auVar92,auVar20);
  auVar20 = vfmadd231ps_fma(auVar163,auVar92,auVar23);
  auVar30 = vfmadd231ps_fma(auVar89,auVar203,auVar90);
  auVar141 = vfmadd231ps_fma(auVar91,auVar203,auVar19);
  auVar195._8_4_ = 0x7fffffff;
  auVar195._0_8_ = 0x7fffffff7fffffff;
  auVar195._12_4_ = 0x7fffffff;
  auVar142 = vfmadd231ps_fma(auVar20,auVar203,auVar22);
  auVar90 = vandps_avx(auVar195,auVar94);
  auVar192._8_4_ = 0x219392ef;
  auVar192._0_8_ = 0x219392ef219392ef;
  auVar192._12_4_ = 0x219392ef;
  uVar83 = vcmpps_avx512vl(auVar90,auVar192,1);
  bVar80 = (bool)((byte)uVar83 & 1);
  auVar86._0_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar94._0_4_;
  bVar80 = (bool)((byte)(uVar83 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar94._4_4_;
  bVar80 = (bool)((byte)(uVar83 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar94._8_4_;
  bVar80 = (bool)((byte)(uVar83 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar94._12_4_;
  auVar90 = vandps_avx(auVar195,auVar28);
  uVar83 = vcmpps_avx512vl(auVar90,auVar192,1);
  bVar80 = (bool)((byte)uVar83 & 1);
  auVar87._0_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar28._0_4_;
  bVar80 = (bool)((byte)(uVar83 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar28._4_4_;
  bVar80 = (bool)((byte)(uVar83 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar28._8_4_;
  bVar80 = (bool)((byte)(uVar83 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar28._12_4_;
  auVar90 = vandps_avx(auVar195,auVar29);
  uVar83 = vcmpps_avx512vl(auVar90,auVar192,1);
  bVar80 = (bool)((byte)uVar83 & 1);
  auVar88._0_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar29._0_4_;
  bVar80 = (bool)((byte)(uVar83 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar29._4_4_;
  bVar80 = (bool)((byte)(uVar83 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar29._8_4_;
  bVar80 = (bool)((byte)(uVar83 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar29._12_4_;
  auVar89 = vrcp14ps_avx512vl(auVar86);
  auVar193._8_4_ = 0x3f800000;
  auVar193._0_8_ = &DAT_3f8000003f800000;
  auVar193._12_4_ = 0x3f800000;
  auVar90 = vfnmadd213ps_fma(auVar86,auVar89,auVar193);
  auVar94 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar87);
  auVar90 = vfnmadd213ps_fma(auVar87,auVar89,auVar193);
  auVar29 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar88);
  auVar90 = vfnmadd213ps_fma(auVar88,auVar89,auVar193);
  auVar27 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
  fVar169 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar26 + 0x16)) *
            *(float *)(prim + lVar26 + 0x1a);
  auVar190._4_4_ = fVar169;
  auVar190._0_4_ = fVar169;
  auVar190._8_4_ = fVar169;
  auVar190._12_4_ = fVar169;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar74 * 7 + 6);
  auVar90 = vpmovsxwd_avx(auVar90);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar74 * 0xb + 6);
  auVar89 = vpmovsxwd_avx(auVar89);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar19 = vsubps_avx(auVar89,auVar90);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar74 * 9 + 6);
  auVar89 = vpmovsxwd_avx(auVar91);
  auVar91 = vfmadd213ps_fma(auVar19,auVar190,auVar90);
  auVar90 = vcvtdq2ps_avx(auVar89);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar74 * 0xd + 6);
  auVar89 = vpmovsxwd_avx(auVar19);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar19 = vfmadd213ps_fma(auVar89,auVar190,auVar90);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar74 * 0x12 + 6);
  auVar90 = vpmovsxwd_avx(auVar20);
  auVar90 = vcvtdq2ps_avx(auVar90);
  uVar83 = (ulong)(uint)((int)(uVar74 * 5) << 2);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar74 * 2 + uVar83 + 6);
  auVar89 = vpmovsxwd_avx(auVar21);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar20 = vfmadd213ps_fma(auVar89,auVar190,auVar90);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar83 + 6);
  auVar90 = vpmovsxwd_avx(auVar22);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar74 * 0x18 + 6);
  auVar89 = vpmovsxwd_avx(auVar23);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar21 = vfmadd213ps_fma(auVar89,auVar190,auVar90);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar74 * 0x1d + 6);
  auVar90 = vpmovsxwd_avx(auVar24);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar74 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar89 = vpmovsxwd_avx(auVar92);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar22 = vfmadd213ps_fma(auVar89,auVar190,auVar90);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar74) + 6);
  auVar90 = vpmovsxwd_avx(auVar93);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar74 * 0x23 + 6);
  auVar89 = vpmovsxwd_avx(auVar28);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar89 = vfmadd213ps_fma(auVar89,auVar190,auVar90);
  auVar90 = vsubps_avx(auVar91,auVar30);
  auVar191._0_4_ = auVar94._0_4_ * auVar90._0_4_;
  auVar191._4_4_ = auVar94._4_4_ * auVar90._4_4_;
  auVar191._8_4_ = auVar94._8_4_ * auVar90._8_4_;
  auVar191._12_4_ = auVar94._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar19,auVar30);
  auVar157._0_4_ = auVar94._0_4_ * auVar90._0_4_;
  auVar157._4_4_ = auVar94._4_4_ * auVar90._4_4_;
  auVar157._8_4_ = auVar94._8_4_ * auVar90._8_4_;
  auVar157._12_4_ = auVar94._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar20,auVar141);
  auVar183._0_4_ = auVar29._0_4_ * auVar90._0_4_;
  auVar183._4_4_ = auVar29._4_4_ * auVar90._4_4_;
  auVar183._8_4_ = auVar29._8_4_ * auVar90._8_4_;
  auVar183._12_4_ = auVar29._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar21,auVar141);
  auVar153._0_4_ = auVar29._0_4_ * auVar90._0_4_;
  auVar153._4_4_ = auVar29._4_4_ * auVar90._4_4_;
  auVar153._8_4_ = auVar29._8_4_ * auVar90._8_4_;
  auVar153._12_4_ = auVar29._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar22,auVar142);
  auVar171._0_4_ = auVar27._0_4_ * auVar90._0_4_;
  auVar171._4_4_ = auVar27._4_4_ * auVar90._4_4_;
  auVar171._8_4_ = auVar27._8_4_ * auVar90._8_4_;
  auVar171._12_4_ = auVar27._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar89,auVar142);
  auVar143._0_4_ = auVar27._0_4_ * auVar90._0_4_;
  auVar143._4_4_ = auVar27._4_4_ * auVar90._4_4_;
  auVar143._8_4_ = auVar27._8_4_ * auVar90._8_4_;
  auVar143._12_4_ = auVar27._12_4_ * auVar90._12_4_;
  auVar90 = vpminsd_avx(auVar191,auVar157);
  auVar89 = vpminsd_avx(auVar183,auVar153);
  auVar90 = vmaxps_avx(auVar90,auVar89);
  auVar89 = vpminsd_avx(auVar171,auVar143);
  uVar139 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar94._4_4_ = uVar139;
  auVar94._0_4_ = uVar139;
  auVar94._8_4_ = uVar139;
  auVar94._12_4_ = uVar139;
  auVar89 = vmaxps_avx512vl(auVar89,auVar94);
  auVar90 = vmaxps_avx(auVar90,auVar89);
  auVar29._8_4_ = 0x3f7ffffa;
  auVar29._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar29._12_4_ = 0x3f7ffffa;
  local_2b0 = vmulps_avx512vl(auVar90,auVar29);
  auVar90 = vpmaxsd_avx(auVar191,auVar157);
  auVar89 = vpmaxsd_avx(auVar183,auVar153);
  auVar90 = vminps_avx(auVar90,auVar89);
  auVar89 = vpmaxsd_avx(auVar171,auVar143);
  uVar139 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar27._4_4_ = uVar139;
  auVar27._0_4_ = uVar139;
  auVar27._8_4_ = uVar139;
  auVar27._12_4_ = uVar139;
  auVar89 = vminps_avx512vl(auVar89,auVar27);
  auVar90 = vminps_avx(auVar90,auVar89);
  auVar30._8_4_ = 0x3f800003;
  auVar30._0_8_ = 0x3f8000033f800003;
  auVar30._12_4_ = 0x3f800003;
  auVar90 = vmulps_avx512vl(auVar90,auVar30);
  auVar89 = vpbroadcastd_avx512vl();
  uVar140 = vcmpps_avx512vl(local_2b0,auVar90,2);
  uVar83 = vpcmpgtd_avx512vl(auVar89,_DAT_01ff0cf0);
  uVar83 = ((byte)uVar140 & 0xf) & uVar83;
  local_7d9 = (char)uVar83 != '\0';
  if (local_7d9) {
    local_670 = pre->ray_space + k;
    local_2a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_668 = prim;
    do {
      lVar26 = 0;
      for (uVar74 = uVar83; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar81 = *(uint *)(local_668 + 2);
      pGVar8 = (context->scene->geometries).items[uVar81].ptr;
      local_440._0_8_ = CONCAT44(0,*(uint *)(local_668 + lVar26 * 4 + 6));
      uVar74 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                               CONCAT44(0,*(uint *)(local_668 + lVar26 * 4 + 6)) *
                               pGVar8[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar169 = (pGVar8->time_range).lower;
      fVar169 = pGVar8->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar169) / ((pGVar8->time_range).upper - fVar169)
                );
      auVar90 = vroundss_avx(ZEXT416((uint)fVar169),ZEXT416((uint)fVar169),9);
      auVar90 = vminss_avx(auVar90,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
      auVar90 = vmaxss_avx(ZEXT816(0) << 0x20,auVar90);
      fVar169 = fVar169 - auVar90._0_4_;
      _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar78 = (long)(int)auVar90._0_4_ * 0x38;
      lVar26 = *(long *)(_Var9 + 0x10 + lVar78);
      lVar82 = *(long *)(_Var9 + 0x38 + lVar78);
      lVar10 = *(long *)(_Var9 + 0x48 + lVar78);
      auVar154._4_4_ = fVar169;
      auVar154._0_4_ = fVar169;
      auVar154._8_4_ = fVar169;
      auVar154._12_4_ = fVar169;
      pfVar3 = (float *)(lVar82 + uVar74 * lVar10);
      auVar196._0_4_ = fVar169 * *pfVar3;
      auVar196._4_4_ = fVar169 * pfVar3[1];
      auVar196._8_4_ = fVar169 * pfVar3[2];
      auVar196._12_4_ = fVar169 * pfVar3[3];
      pfVar3 = (float *)(lVar82 + (uVar74 + 1) * lVar10);
      auVar197._0_4_ = fVar169 * *pfVar3;
      auVar197._4_4_ = fVar169 * pfVar3[1];
      auVar197._8_4_ = fVar169 * pfVar3[2];
      auVar197._12_4_ = fVar169 * pfVar3[3];
      auVar90 = vmulps_avx512vl(auVar154,*(undefined1 (*) [16])(lVar82 + (uVar74 + 2) * lVar10));
      auVar89 = vmulps_avx512vl(auVar154,*(undefined1 (*) [16])(lVar82 + lVar10 * (uVar74 + 3)));
      lVar82 = *(long *)(_Var9 + lVar78);
      fVar169 = 1.0 - fVar169;
      auVar144._4_4_ = fVar169;
      auVar144._0_4_ = fVar169;
      auVar144._8_4_ = fVar169;
      auVar144._12_4_ = fVar169;
      local_750 = vfmadd231ps_fma(auVar196,auVar144,*(undefined1 (*) [16])(lVar82 + lVar26 * uVar74)
                                 );
      local_510 = vfmadd231ps_fma(auVar197,auVar144,
                                  *(undefined1 (*) [16])(lVar82 + lVar26 * (uVar74 + 1)));
      local_520 = vfmadd231ps_avx512vl
                            (auVar90,auVar144,*(undefined1 (*) [16])(lVar82 + lVar26 * (uVar74 + 2))
                            );
      local_530 = vfmadd231ps_avx512vl
                            (auVar89,auVar144,*(undefined1 (*) [16])(lVar82 + lVar26 * (uVar74 + 3))
                            );
      iVar7 = (int)pGVar8[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      lVar26 = (long)iVar7 * 0x44;
      auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar91 = vsubps_avx(local_750,auVar90);
      uVar139 = auVar91._0_4_;
      auVar158._4_4_ = uVar139;
      auVar158._0_4_ = uVar139;
      auVar158._8_4_ = uVar139;
      auVar158._12_4_ = uVar139;
      auVar89 = vshufps_avx(auVar91,auVar91,0x55);
      aVar4 = (local_670->vx).field_0;
      aVar5 = (local_670->vy).field_0;
      fVar169 = (local_670->vz).field_0.m128[0];
      fVar151 = *(float *)((long)&(local_670->vz).field_0 + 4);
      fVar168 = *(float *)((long)&(local_670->vz).field_0 + 8);
      fVar178 = *(float *)((long)&(local_670->vz).field_0 + 0xc);
      auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
      auVar199._0_4_ = fVar169 * auVar91._0_4_;
      auVar199._4_4_ = fVar151 * auVar91._4_4_;
      auVar199._8_4_ = fVar168 * auVar91._8_4_;
      auVar199._12_4_ = fVar178 * auVar91._12_4_;
      auVar89 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar5,auVar89);
      auVar19 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar4,auVar158);
      auVar91 = vsubps_avx(local_510,auVar90);
      uVar139 = auVar91._0_4_;
      auVar159._4_4_ = uVar139;
      auVar159._0_4_ = uVar139;
      auVar159._8_4_ = uVar139;
      auVar159._12_4_ = uVar139;
      auVar89 = vshufps_avx(auVar91,auVar91,0x55);
      auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
      auVar200._0_4_ = fVar169 * auVar91._0_4_;
      auVar200._4_4_ = fVar151 * auVar91._4_4_;
      auVar200._8_4_ = fVar168 * auVar91._8_4_;
      auVar200._12_4_ = fVar178 * auVar91._12_4_;
      auVar89 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar5,auVar89);
      auVar20 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar4,auVar159);
      auVar91 = vsubps_avx512vl(local_520,auVar90);
      uVar139 = auVar91._0_4_;
      auVar160._4_4_ = uVar139;
      auVar160._0_4_ = uVar139;
      auVar160._8_4_ = uVar139;
      auVar160._12_4_ = uVar139;
      auVar89 = vshufps_avx(auVar91,auVar91,0x55);
      auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
      auVar201._0_4_ = fVar169 * auVar91._0_4_;
      auVar201._4_4_ = fVar151 * auVar91._4_4_;
      auVar201._8_4_ = fVar168 * auVar91._8_4_;
      auVar201._12_4_ = fVar178 * auVar91._12_4_;
      auVar89 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar5,auVar89);
      auVar91 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar4,auVar160);
      auVar89 = vsubps_avx512vl(local_530,auVar90);
      uVar139 = auVar89._0_4_;
      auVar155._4_4_ = uVar139;
      auVar155._0_4_ = uVar139;
      auVar155._8_4_ = uVar139;
      auVar155._12_4_ = uVar139;
      auVar90 = vshufps_avx(auVar89,auVar89,0x55);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar205._0_4_ = fVar169 * auVar89._0_4_;
      auVar205._4_4_ = fVar151 * auVar89._4_4_;
      auVar205._8_4_ = fVar168 * auVar89._8_4_;
      auVar205._12_4_ = fVar178 * auVar89._12_4_;
      auVar90 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar5,auVar90);
      auVar21 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar4,auVar155);
      auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar26);
      uVar139 = auVar19._0_4_;
      local_560._4_4_ = uVar139;
      local_560._0_4_ = uVar139;
      local_560._8_4_ = uVar139;
      local_560._12_4_ = uVar139;
      local_560._16_4_ = uVar139;
      local_560._20_4_ = uVar139;
      local_560._24_4_ = uVar139;
      local_560._28_4_ = uVar139;
      auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x484);
      auVar95._8_4_ = 1;
      auVar95._0_8_ = 0x100000001;
      auVar95._12_4_ = 1;
      auVar95._16_4_ = 1;
      auVar95._20_4_ = 1;
      auVar95._24_4_ = 1;
      auVar95._28_4_ = 1;
      local_500 = vpermps_avx2(auVar95,ZEXT1632(auVar19));
      local_580 = vbroadcastss_avx512vl(auVar20);
      local_6e0 = vpermps_avx512vl(auVar95,ZEXT1632(auVar20));
      auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x908);
      local_700 = vbroadcastss_avx512vl(auVar91);
      local_5c0 = vpermps_avx512vl(auVar95,ZEXT1632(auVar91));
      auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0xd8c);
      local_5e0 = vbroadcastss_avx512vl(auVar21);
      auVar215 = ZEXT3264(local_5e0);
      local_600 = vpermps_avx512vl(auVar95,ZEXT1632(auVar21));
      auVar216 = ZEXT3264(local_600);
      auVar95 = vmulps_avx512vl(local_5e0,auVar107);
      auVar96 = vmulps_avx512vl(local_600,auVar107);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar108,local_700);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar108,local_5c0);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar112,local_580);
      auVar97 = vfmadd231ps_avx512vl(auVar96,auVar112,local_6e0);
      auVar98 = vfmadd231ps_avx512vl(auVar95,auVar110,local_560);
      auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar26);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x484);
      auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x908);
      auVar99 = vfmadd231ps_avx512vl(auVar97,auVar110,local_500);
      auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0xd8c);
      auVar100 = vmulps_avx512vl(local_5e0,auVar97);
      auVar101 = vmulps_avx512vl(local_600,auVar97);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,local_700);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar106,local_5c0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,local_580);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,local_6e0);
      auVar22 = vfmadd231ps_fma(auVar100,auVar95,local_560);
      auVar23 = vfmadd231ps_fma(auVar101,auVar95,local_500);
      auVar101 = vsubps_avx512vl(ZEXT1632(auVar22),auVar98);
      auVar102 = vsubps_avx512vl(ZEXT1632(auVar23),auVar99);
      auVar100 = vmulps_avx512vl(auVar99,auVar101);
      auVar103 = vmulps_avx512vl(auVar98,auVar102);
      auVar100 = vsubps_avx512vl(auVar100,auVar103);
      auVar90 = vshufps_avx(local_750,local_750,0xff);
      uVar140 = auVar90._0_8_;
      local_80._8_8_ = uVar140;
      local_80._0_8_ = uVar140;
      local_80._16_8_ = uVar140;
      local_80._24_8_ = uVar140;
      auVar90 = vshufps_avx(local_510,local_510,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar90);
      auVar90 = vshufps_avx512vl(local_520,local_520,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar90);
      auVar90 = vshufps_avx512vl(local_530,local_530,0xff);
      uVar140 = auVar90._0_8_;
      register0x00001248 = uVar140;
      local_e0 = uVar140;
      register0x00001250 = uVar140;
      register0x00001258 = uVar140;
      auVar103 = vmulps_avx512vl(_local_e0,auVar107);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar108,local_c0);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar112,local_a0);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar110,local_80);
      auVar104 = vmulps_avx512vl(_local_e0,auVar97);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar106,local_c0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar96,local_a0);
      auVar24 = vfmadd231ps_fma(auVar104,auVar95,local_80);
      auVar104 = vmulps_avx512vl(auVar102,auVar102);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,auVar101);
      auVar105 = vmaxps_avx512vl(auVar103,ZEXT1632(auVar24));
      auVar105 = vmulps_avx512vl(auVar105,auVar105);
      auVar104 = vmulps_avx512vl(auVar105,auVar104);
      auVar100 = vmulps_avx512vl(auVar100,auVar100);
      uVar140 = vcmpps_avx512vl(auVar100,auVar104,2);
      auVar90 = vblendps_avx(auVar19,local_750,8);
      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar89 = vandps_avx512vl(auVar90,auVar92);
      auVar90 = vblendps_avx(auVar20,local_510,8);
      auVar90 = vandps_avx512vl(auVar90,auVar92);
      auVar89 = vmaxps_avx(auVar89,auVar90);
      auVar90 = vblendps_avx(auVar91,local_520,8);
      auVar93 = vandps_avx512vl(auVar90,auVar92);
      auVar90 = vblendps_avx(auVar21,local_530,8);
      auVar90 = vandps_avx512vl(auVar90,auVar92);
      auVar90 = vmaxps_avx(auVar93,auVar90);
      auVar90 = vmaxps_avx(auVar89,auVar90);
      auVar89 = vmovshdup_avx(auVar90);
      auVar89 = vmaxss_avx(auVar89,auVar90);
      auVar90 = vshufpd_avx(auVar90,auVar90,1);
      auVar90 = vmaxss_avx(auVar90,auVar89);
      auVar89 = vcvtsi2ss_avx512f(local_520,iVar7);
      local_460._0_16_ = auVar89;
      auVar104._0_4_ = auVar89._0_4_;
      auVar104._4_4_ = auVar104._0_4_;
      auVar104._8_4_ = auVar104._0_4_;
      auVar104._12_4_ = auVar104._0_4_;
      auVar104._16_4_ = auVar104._0_4_;
      auVar104._20_4_ = auVar104._0_4_;
      auVar104._24_4_ = auVar104._0_4_;
      auVar104._28_4_ = auVar104._0_4_;
      uVar25 = vcmpps_avx512vl(auVar104,_DAT_02020f40,0xe);
      local_370 = (byte)uVar140 & (byte)uVar25;
      fVar151 = auVar90._0_4_ * 4.7683716e-07;
      auVar100._8_4_ = 2;
      auVar100._0_8_ = 0x200000002;
      auVar100._12_4_ = 2;
      auVar100._16_4_ = 2;
      auVar100._20_4_ = 2;
      auVar100._24_4_ = 2;
      auVar100._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar100,ZEXT1632(auVar19));
      local_120 = vpermps_avx512vl(auVar100,ZEXT1632(auVar20));
      local_140 = vpermps_avx512vl(auVar100,ZEXT1632(auVar91));
      auVar100 = vpermps_avx2(auVar100,ZEXT1632(auVar21));
      fVar169 = *(float *)(ray + k * 4 + 0x60);
      auVar90 = auVar102._0_16_;
      _local_770 = ZEXT416((uint)fVar151);
      if (local_370 == 0) {
        bVar80 = false;
        auVar90 = vxorps_avx512vl(auVar90,auVar90);
        auVar213 = ZEXT1664(auVar90);
        auVar210 = ZEXT3264(local_560);
        auVar211 = ZEXT3264(local_500);
        auVar212 = ZEXT3264(local_580);
        auVar209 = ZEXT3264(local_6e0);
        auVar217 = ZEXT3264(local_700);
        auVar214 = ZEXT3264(local_5c0);
      }
      else {
        fStack_61c = 0.0;
        fStack_618 = 0.0;
        fStack_614 = 0.0;
        auVar97 = vmulps_avx512vl(auVar100,auVar97);
        auVar106 = vfmadd213ps_avx512vl(auVar106,local_140,auVar97);
        auVar96 = vfmadd213ps_avx512vl(auVar96,local_120,auVar106);
        auVar105 = vfmadd213ps_avx512vl(auVar95,local_100,auVar96);
        auVar107 = vmulps_avx512vl(auVar100,auVar107);
        auVar108 = vfmadd213ps_avx512vl(auVar108,local_140,auVar107);
        auVar96 = vfmadd213ps_avx512vl(auVar112,local_120,auVar108);
        auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1210);
        auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1694);
        auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1b18);
        auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1f9c);
        auVar109 = vfmadd213ps_avx512vl(auVar110,local_100,auVar96);
        auVar110 = vmulps_avx512vl(local_5e0,auVar95);
        auVar96 = vmulps_avx512vl(local_600,auVar95);
        auVar202._0_4_ = auVar100._0_4_ * auVar95._0_4_;
        auVar202._4_4_ = auVar100._4_4_ * auVar95._4_4_;
        auVar202._8_4_ = auVar100._8_4_ * auVar95._8_4_;
        auVar202._12_4_ = auVar100._12_4_ * auVar95._12_4_;
        auVar202._16_4_ = auVar100._16_4_ * auVar95._16_4_;
        auVar202._20_4_ = auVar100._20_4_ * auVar95._20_4_;
        auVar202._24_4_ = auVar100._24_4_ * auVar95._24_4_;
        auVar202._28_4_ = 0;
        auVar217 = ZEXT3264(local_700);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar107,local_700);
        auVar95 = vfmadd231ps_avx512vl(auVar96,auVar107,local_5c0);
        auVar107 = vfmadd231ps_avx512vl(auVar202,local_140,auVar107);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar108,local_580);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar108,local_6e0);
        auVar96 = vfmadd231ps_avx512vl(auVar107,local_120,auVar108);
        auVar106 = vfmadd231ps_avx512vl(auVar110,auVar112,local_560);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar112,local_500);
        auVar110 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1210);
        auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1b18);
        auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1f9c);
        auVar96 = vfmadd231ps_avx512vl(auVar96,local_100,auVar112);
        auVar97 = vmulps_avx512vl(local_5e0,auVar107);
        auVar111 = vmulps_avx512vl(local_600,auVar107);
        auVar112._4_4_ = auVar100._4_4_ * auVar107._4_4_;
        auVar112._0_4_ = auVar100._0_4_ * auVar107._0_4_;
        auVar112._8_4_ = auVar100._8_4_ * auVar107._8_4_;
        auVar112._12_4_ = auVar100._12_4_ * auVar107._12_4_;
        auVar112._16_4_ = auVar100._16_4_ * auVar107._16_4_;
        auVar112._20_4_ = auVar100._20_4_ * auVar107._20_4_;
        auVar112._24_4_ = auVar100._24_4_ * auVar107._24_4_;
        auVar112._28_4_ = auVar107._28_4_;
        auVar107 = vfmadd231ps_avx512vl(auVar97,auVar108,local_700);
        auVar97 = vfmadd231ps_avx512vl(auVar111,auVar108,local_5c0);
        auVar108 = vfmadd231ps_avx512vl(auVar112,local_140,auVar108);
        auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1694);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar112,local_580);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar112,local_6e0);
        auVar112 = vfmadd231ps_avx512vl(auVar108,local_120,auVar112);
        auVar108 = vfmadd231ps_avx512vl(auVar107,auVar110,local_560);
        auVar107 = vfmadd231ps_avx512vl(auVar97,auVar110,local_500);
        auVar97 = vfmadd231ps_avx512vl(auVar112,local_100,auVar110);
        auVar206._8_4_ = 0x7fffffff;
        auVar206._0_8_ = 0x7fffffff7fffffff;
        auVar206._12_4_ = 0x7fffffff;
        auVar206._16_4_ = 0x7fffffff;
        auVar206._20_4_ = 0x7fffffff;
        auVar206._24_4_ = 0x7fffffff;
        auVar206._28_4_ = 0x7fffffff;
        auVar110 = vandps_avx(auVar106,auVar206);
        auVar112 = vandps_avx(auVar95,auVar206);
        auVar112 = vmaxps_avx(auVar110,auVar112);
        auVar110 = vandps_avx(auVar96,auVar206);
        auVar110 = vmaxps_avx(auVar112,auVar110);
        auVar96 = vbroadcastss_avx512vl(_local_770);
        uVar74 = vcmpps_avx512vl(auVar110,auVar96,1);
        bVar80 = (bool)((byte)uVar74 & 1);
        auVar111._0_4_ = (float)((uint)bVar80 * auVar101._0_4_ | (uint)!bVar80 * auVar106._0_4_);
        bVar80 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar80 * auVar101._4_4_ | (uint)!bVar80 * auVar106._4_4_);
        bVar80 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar80 * auVar101._8_4_ | (uint)!bVar80 * auVar106._8_4_);
        bVar80 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar80 * auVar101._12_4_ | (uint)!bVar80 * auVar106._12_4_);
        bVar80 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar80 * auVar101._16_4_ | (uint)!bVar80 * auVar106._16_4_);
        bVar80 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar80 * auVar101._20_4_ | (uint)!bVar80 * auVar106._20_4_);
        bVar80 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar80 * auVar101._24_4_ | (uint)!bVar80 * auVar106._24_4_);
        bVar80 = SUB81(uVar74 >> 7,0);
        auVar111._28_4_ = (uint)bVar80 * auVar101._28_4_ | (uint)!bVar80 * auVar106._28_4_;
        bVar80 = (bool)((byte)uVar74 & 1);
        auVar113._0_4_ = (float)((uint)bVar80 * auVar102._0_4_ | (uint)!bVar80 * auVar95._0_4_);
        bVar80 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar80 * auVar102._4_4_ | (uint)!bVar80 * auVar95._4_4_);
        bVar80 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar80 * auVar102._8_4_ | (uint)!bVar80 * auVar95._8_4_);
        bVar80 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar80 * auVar102._12_4_ | (uint)!bVar80 * auVar95._12_4_);
        bVar80 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar80 * auVar102._16_4_ | (uint)!bVar80 * auVar95._16_4_);
        bVar80 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar80 * auVar102._20_4_ | (uint)!bVar80 * auVar95._20_4_);
        bVar80 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar80 * auVar102._24_4_ | (uint)!bVar80 * auVar95._24_4_);
        bVar80 = SUB81(uVar74 >> 7,0);
        auVar113._28_4_ = (uint)bVar80 * auVar102._28_4_ | (uint)!bVar80 * auVar95._28_4_;
        auVar110 = vandps_avx(auVar206,auVar108);
        auVar112 = vandps_avx(auVar107,auVar206);
        auVar112 = vmaxps_avx(auVar110,auVar112);
        auVar110 = vandps_avx(auVar97,auVar206);
        auVar110 = vmaxps_avx(auVar112,auVar110);
        uVar74 = vcmpps_avx512vl(auVar110,auVar96,1);
        bVar80 = (bool)((byte)uVar74 & 1);
        auVar114._0_4_ = (float)((uint)bVar80 * auVar101._0_4_ | (uint)!bVar80 * auVar108._0_4_);
        bVar80 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar80 * auVar101._4_4_ | (uint)!bVar80 * auVar108._4_4_);
        bVar80 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar80 * auVar101._8_4_ | (uint)!bVar80 * auVar108._8_4_);
        bVar80 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar80 * auVar101._12_4_ | (uint)!bVar80 * auVar108._12_4_);
        bVar80 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar114._16_4_ = (float)((uint)bVar80 * auVar101._16_4_ | (uint)!bVar80 * auVar108._16_4_);
        bVar80 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar114._20_4_ = (float)((uint)bVar80 * auVar101._20_4_ | (uint)!bVar80 * auVar108._20_4_);
        bVar80 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar114._24_4_ = (float)((uint)bVar80 * auVar101._24_4_ | (uint)!bVar80 * auVar108._24_4_);
        bVar80 = SUB81(uVar74 >> 7,0);
        auVar114._28_4_ = (uint)bVar80 * auVar101._28_4_ | (uint)!bVar80 * auVar108._28_4_;
        bVar80 = (bool)((byte)uVar74 & 1);
        auVar115._0_4_ = (float)((uint)bVar80 * auVar102._0_4_ | (uint)!bVar80 * auVar107._0_4_);
        bVar80 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar80 * auVar102._4_4_ | (uint)!bVar80 * auVar107._4_4_);
        bVar80 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar80 * auVar102._8_4_ | (uint)!bVar80 * auVar107._8_4_);
        bVar80 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar80 * auVar102._12_4_ | (uint)!bVar80 * auVar107._12_4_);
        bVar80 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar80 * auVar102._16_4_ | (uint)!bVar80 * auVar107._16_4_);
        bVar80 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar80 * auVar102._20_4_ | (uint)!bVar80 * auVar107._20_4_);
        bVar80 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar80 * auVar102._24_4_ | (uint)!bVar80 * auVar107._24_4_);
        bVar80 = SUB81(uVar74 >> 7,0);
        auVar115._28_4_ = (uint)bVar80 * auVar102._28_4_ | (uint)!bVar80 * auVar107._28_4_;
        auVar94 = vxorps_avx512vl(auVar90,auVar90);
        auVar213 = ZEXT1664(auVar94);
        auVar110 = vfmadd213ps_avx512vl(auVar111,auVar111,ZEXT1632(auVar94));
        auVar90 = vfmadd231ps_fma(auVar110,auVar113,auVar113);
        auVar112 = vrsqrt14ps_avx512vl(ZEXT1632(auVar90));
        fVar168 = auVar112._0_4_;
        fVar178 = auVar112._4_4_;
        fVar179 = auVar112._8_4_;
        fVar180 = auVar112._12_4_;
        fVar161 = auVar112._16_4_;
        fVar167 = auVar112._20_4_;
        fVar84 = auVar112._24_4_;
        auVar110._4_4_ = fVar178 * fVar178 * fVar178 * auVar90._4_4_ * -0.5;
        auVar110._0_4_ = fVar168 * fVar168 * fVar168 * auVar90._0_4_ * -0.5;
        auVar110._8_4_ = fVar179 * fVar179 * fVar179 * auVar90._8_4_ * -0.5;
        auVar110._12_4_ = fVar180 * fVar180 * fVar180 * auVar90._12_4_ * -0.5;
        auVar110._16_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar110._20_4_ = fVar167 * fVar167 * fVar167 * -0.0;
        auVar110._24_4_ = fVar84 * fVar84 * fVar84 * -0.0;
        auVar110._28_4_ = auVar97._28_4_;
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar95,auVar112);
        auVar108._4_4_ = auVar113._4_4_ * auVar110._4_4_;
        auVar108._0_4_ = auVar113._0_4_ * auVar110._0_4_;
        auVar108._8_4_ = auVar113._8_4_ * auVar110._8_4_;
        auVar108._12_4_ = auVar113._12_4_ * auVar110._12_4_;
        auVar108._16_4_ = auVar113._16_4_ * auVar110._16_4_;
        auVar108._20_4_ = auVar113._20_4_ * auVar110._20_4_;
        auVar108._24_4_ = auVar113._24_4_ * auVar110._24_4_;
        auVar108._28_4_ = 0;
        auVar107._4_4_ = auVar110._4_4_ * -auVar111._4_4_;
        auVar107._0_4_ = auVar110._0_4_ * -auVar111._0_4_;
        auVar107._8_4_ = auVar110._8_4_ * -auVar111._8_4_;
        auVar107._12_4_ = auVar110._12_4_ * -auVar111._12_4_;
        auVar107._16_4_ = auVar110._16_4_ * -auVar111._16_4_;
        auVar107._20_4_ = auVar110._20_4_ * -auVar111._20_4_;
        auVar107._24_4_ = auVar110._24_4_ * -auVar111._24_4_;
        auVar107._28_4_ = auVar113._28_4_;
        auVar110 = vmulps_avx512vl(auVar110,ZEXT1632(auVar94));
        auVar101 = ZEXT1632(auVar94);
        auVar112 = vfmadd213ps_avx512vl(auVar114,auVar114,auVar101);
        auVar90 = vfmadd231ps_fma(auVar112,auVar115,auVar115);
        auVar112 = vrsqrt14ps_avx512vl(ZEXT1632(auVar90));
        fVar168 = auVar112._0_4_;
        fVar178 = auVar112._4_4_;
        fVar179 = auVar112._8_4_;
        fVar180 = auVar112._12_4_;
        fVar161 = auVar112._16_4_;
        fVar167 = auVar112._20_4_;
        fVar84 = auVar112._24_4_;
        auVar96._4_4_ = fVar178 * fVar178 * fVar178 * auVar90._4_4_ * -0.5;
        auVar96._0_4_ = fVar168 * fVar168 * fVar168 * auVar90._0_4_ * -0.5;
        auVar96._8_4_ = fVar179 * fVar179 * fVar179 * auVar90._8_4_ * -0.5;
        auVar96._12_4_ = fVar180 * fVar180 * fVar180 * auVar90._12_4_ * -0.5;
        auVar96._16_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar96._20_4_ = fVar167 * fVar167 * fVar167 * -0.0;
        auVar96._24_4_ = fVar84 * fVar84 * fVar84 * -0.0;
        auVar96._28_4_ = 0;
        auVar95 = vfmadd231ps_avx512vl(auVar96,auVar95,auVar112);
        auVar106._4_4_ = auVar115._4_4_ * auVar95._4_4_;
        auVar106._0_4_ = auVar115._0_4_ * auVar95._0_4_;
        auVar106._8_4_ = auVar115._8_4_ * auVar95._8_4_;
        auVar106._12_4_ = auVar115._12_4_ * auVar95._12_4_;
        auVar106._16_4_ = auVar115._16_4_ * auVar95._16_4_;
        auVar106._20_4_ = auVar115._20_4_ * auVar95._20_4_;
        auVar106._24_4_ = auVar115._24_4_ * auVar95._24_4_;
        auVar106._28_4_ = auVar112._28_4_;
        auVar97._4_4_ = -auVar114._4_4_ * auVar95._4_4_;
        auVar97._0_4_ = -auVar114._0_4_ * auVar95._0_4_;
        auVar97._8_4_ = -auVar114._8_4_ * auVar95._8_4_;
        auVar97._12_4_ = -auVar114._12_4_ * auVar95._12_4_;
        auVar97._16_4_ = -auVar114._16_4_ * auVar95._16_4_;
        auVar97._20_4_ = -auVar114._20_4_ * auVar95._20_4_;
        auVar97._24_4_ = -auVar114._24_4_ * auVar95._24_4_;
        auVar97._28_4_ = auVar114._28_4_ ^ 0x80000000;
        auVar112 = vmulps_avx512vl(auVar95,auVar101);
        auVar90 = vfmadd213ps_fma(auVar108,auVar103,auVar98);
        auVar89 = vfmadd213ps_fma(auVar107,auVar103,auVar99);
        auVar95 = vfmadd213ps_avx512vl(auVar110,auVar103,auVar109);
        auVar96 = vfmadd213ps_avx512vl(auVar106,ZEXT1632(auVar24),ZEXT1632(auVar22));
        auVar92 = vfnmadd213ps_fma(auVar108,auVar103,auVar98);
        auVar98 = ZEXT1632(auVar24);
        auVar91 = vfmadd213ps_fma(auVar97,auVar98,ZEXT1632(auVar23));
        auVar93 = vfnmadd213ps_fma(auVar107,auVar103,auVar99);
        auVar19 = vfmadd213ps_fma(auVar112,auVar98,auVar105);
        auVar108 = vfnmadd231ps_avx512vl(auVar109,auVar103,auVar110);
        auVar22 = vfnmadd213ps_fma(auVar106,auVar98,ZEXT1632(auVar22));
        auVar23 = vfnmadd213ps_fma(auVar97,auVar98,ZEXT1632(auVar23));
        auVar28 = vfnmadd231ps_fma(auVar105,ZEXT1632(auVar24),auVar112);
        auVar112 = vsubps_avx512vl(auVar96,ZEXT1632(auVar92));
        auVar110 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar93));
        auVar107 = vsubps_avx512vl(ZEXT1632(auVar19),auVar108);
        auVar106 = vmulps_avx512vl(auVar110,auVar108);
        auVar20 = vfmsub231ps_fma(auVar106,ZEXT1632(auVar93),auVar107);
        auVar98._4_4_ = auVar92._4_4_ * auVar107._4_4_;
        auVar98._0_4_ = auVar92._0_4_ * auVar107._0_4_;
        auVar98._8_4_ = auVar92._8_4_ * auVar107._8_4_;
        auVar98._12_4_ = auVar92._12_4_ * auVar107._12_4_;
        auVar98._16_4_ = auVar107._16_4_ * 0.0;
        auVar98._20_4_ = auVar107._20_4_ * 0.0;
        auVar98._24_4_ = auVar107._24_4_ * 0.0;
        auVar98._28_4_ = auVar107._28_4_;
        auVar107 = vfmsub231ps_avx512vl(auVar98,auVar108,auVar112);
        auVar99._4_4_ = auVar93._4_4_ * auVar112._4_4_;
        auVar99._0_4_ = auVar93._0_4_ * auVar112._0_4_;
        auVar99._8_4_ = auVar93._8_4_ * auVar112._8_4_;
        auVar99._12_4_ = auVar93._12_4_ * auVar112._12_4_;
        auVar99._16_4_ = auVar112._16_4_ * 0.0;
        auVar99._20_4_ = auVar112._20_4_ * 0.0;
        auVar99._24_4_ = auVar112._24_4_ * 0.0;
        auVar99._28_4_ = auVar112._28_4_;
        auVar21 = vfmsub231ps_fma(auVar99,ZEXT1632(auVar92),auVar110);
        auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar21),auVar101,auVar107);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar101,ZEXT1632(auVar20));
        auVar111 = ZEXT1632(auVar94);
        uVar74 = vcmpps_avx512vl(auVar110,auVar111,2);
        bVar76 = (byte)uVar74;
        fVar84 = (float)((uint)(bVar76 & 1) * auVar90._0_4_ |
                        (uint)!(bool)(bVar76 & 1) * auVar22._0_4_);
        bVar80 = (bool)((byte)(uVar74 >> 1) & 1);
        fVar132 = (float)((uint)bVar80 * auVar90._4_4_ | (uint)!bVar80 * auVar22._4_4_);
        bVar80 = (bool)((byte)(uVar74 >> 2) & 1);
        fVar134 = (float)((uint)bVar80 * auVar90._8_4_ | (uint)!bVar80 * auVar22._8_4_);
        bVar80 = (bool)((byte)(uVar74 >> 3) & 1);
        fVar136 = (float)((uint)bVar80 * auVar90._12_4_ | (uint)!bVar80 * auVar22._12_4_);
        auVar106 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar134,CONCAT44(fVar132,fVar84))));
        fVar85 = (float)((uint)(bVar76 & 1) * auVar89._0_4_ |
                        (uint)!(bool)(bVar76 & 1) * auVar23._0_4_);
        bVar80 = (bool)((byte)(uVar74 >> 1) & 1);
        fVar133 = (float)((uint)bVar80 * auVar89._4_4_ | (uint)!bVar80 * auVar23._4_4_);
        bVar80 = (bool)((byte)(uVar74 >> 2) & 1);
        fVar135 = (float)((uint)bVar80 * auVar89._8_4_ | (uint)!bVar80 * auVar23._8_4_);
        bVar80 = (bool)((byte)(uVar74 >> 3) & 1);
        fVar137 = (float)((uint)bVar80 * auVar89._12_4_ | (uint)!bVar80 * auVar23._12_4_);
        auVar97 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar135,CONCAT44(fVar133,fVar85))));
        auVar109._0_4_ =
             (float)((uint)(bVar76 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar28._0_4_)
        ;
        bVar80 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar80 * auVar95._4_4_ | (uint)!bVar80 * auVar28._4_4_);
        bVar80 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar80 * auVar95._8_4_ | (uint)!bVar80 * auVar28._8_4_);
        bVar80 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar80 * auVar95._12_4_ | (uint)!bVar80 * auVar28._12_4_);
        fVar178 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar95._16_4_);
        auVar109._16_4_ = fVar178;
        fVar168 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar95._20_4_);
        auVar109._20_4_ = fVar168;
        fVar179 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar95._24_4_);
        auVar109._24_4_ = fVar179;
        iVar1 = (uint)(byte)(uVar74 >> 7) * auVar95._28_4_;
        auVar109._28_4_ = iVar1;
        auVar112 = vblendmps_avx512vl(ZEXT1632(auVar92),auVar96);
        auVar116._0_4_ =
             (uint)(bVar76 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar20._0_4_;
        bVar80 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar116._4_4_ = (uint)bVar80 * auVar112._4_4_ | (uint)!bVar80 * auVar20._4_4_;
        bVar80 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar116._8_4_ = (uint)bVar80 * auVar112._8_4_ | (uint)!bVar80 * auVar20._8_4_;
        bVar80 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar116._12_4_ = (uint)bVar80 * auVar112._12_4_ | (uint)!bVar80 * auVar20._12_4_;
        auVar116._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * auVar112._16_4_;
        auVar116._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * auVar112._20_4_;
        auVar116._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * auVar112._24_4_;
        auVar116._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar112._28_4_;
        auVar112 = vblendmps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar91));
        auVar117._0_4_ =
             (float)((uint)(bVar76 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar89._0_4_
                    );
        bVar80 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar80 * auVar112._4_4_ | (uint)!bVar80 * auVar89._4_4_);
        bVar80 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar80 * auVar112._8_4_ | (uint)!bVar80 * auVar89._8_4_);
        bVar80 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar80 * auVar112._12_4_ | (uint)!bVar80 * auVar89._12_4_);
        fVar180 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar112._16_4_);
        auVar117._16_4_ = fVar180;
        fVar161 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar112._20_4_);
        auVar117._20_4_ = fVar161;
        fVar167 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar112._24_4_);
        auVar117._24_4_ = fVar167;
        auVar117._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar112._28_4_;
        auVar112 = vblendmps_avx512vl(auVar108,ZEXT1632(auVar19));
        auVar118._0_4_ =
             (float)((uint)(bVar76 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar95._0_4_
                    );
        bVar80 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar80 * auVar112._4_4_ | (uint)!bVar80 * auVar95._4_4_);
        bVar80 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar80 * auVar112._8_4_ | (uint)!bVar80 * auVar95._8_4_);
        bVar80 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar80 * auVar112._12_4_ | (uint)!bVar80 * auVar95._12_4_);
        bVar80 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar80 * auVar112._16_4_ | (uint)!bVar80 * auVar95._16_4_);
        bVar80 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar80 * auVar112._20_4_ | (uint)!bVar80 * auVar95._20_4_);
        bVar80 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar80 * auVar112._24_4_ | (uint)!bVar80 * auVar95._24_4_);
        bVar80 = SUB81(uVar74 >> 7,0);
        auVar118._28_4_ = (uint)bVar80 * auVar112._28_4_ | (uint)!bVar80 * auVar95._28_4_;
        auVar119._0_4_ =
             (uint)(bVar76 & 1) * (int)auVar92._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar96._0_4_;
        bVar80 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar119._4_4_ = (uint)bVar80 * (int)auVar92._4_4_ | (uint)!bVar80 * auVar96._4_4_;
        bVar80 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar119._8_4_ = (uint)bVar80 * (int)auVar92._8_4_ | (uint)!bVar80 * auVar96._8_4_;
        bVar80 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar119._12_4_ = (uint)bVar80 * (int)auVar92._12_4_ | (uint)!bVar80 * auVar96._12_4_;
        auVar119._16_4_ = (uint)!(bool)((byte)(uVar74 >> 4) & 1) * auVar96._16_4_;
        auVar119._20_4_ = (uint)!(bool)((byte)(uVar74 >> 5) & 1) * auVar96._20_4_;
        auVar119._24_4_ = (uint)!(bool)((byte)(uVar74 >> 6) & 1) * auVar96._24_4_;
        auVar119._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar96._28_4_;
        bVar80 = (bool)((byte)(uVar74 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar120._0_4_ =
             (uint)(bVar76 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar19._0_4_;
        bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar19._4_4_;
        bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar19._8_4_;
        bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar19._12_4_;
        auVar120._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * auVar108._16_4_;
        auVar120._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * auVar108._20_4_;
        auVar120._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * auVar108._24_4_;
        iVar2 = (uint)(byte)(uVar74 >> 7) * auVar108._28_4_;
        auVar120._28_4_ = iVar2;
        auVar98 = vsubps_avx512vl(auVar119,auVar106);
        auVar112 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar93._12_4_ |
                                                 (uint)!bVar14 * auVar91._12_4_,
                                                 CONCAT48((uint)bVar13 * (int)auVar93._8_4_ |
                                                          (uint)!bVar13 * auVar91._8_4_,
                                                          CONCAT44((uint)bVar80 * (int)auVar93._4_4_
                                                                   | (uint)!bVar80 * auVar91._4_4_,
                                                                   (uint)(bVar76 & 1) *
                                                                   (int)auVar93._0_4_ |
                                                                   (uint)!(bool)(bVar76 & 1) *
                                                                   auVar91._0_4_)))),auVar97);
        auVar108 = vsubps_avx(auVar120,auVar109);
        auVar107 = vsubps_avx(auVar106,auVar116);
        auVar95 = vsubps_avx(auVar97,auVar117);
        auVar96 = vsubps_avx(auVar109,auVar118);
        auVar101._4_4_ = auVar108._4_4_ * fVar132;
        auVar101._0_4_ = auVar108._0_4_ * fVar84;
        auVar101._8_4_ = auVar108._8_4_ * fVar134;
        auVar101._12_4_ = auVar108._12_4_ * fVar136;
        auVar101._16_4_ = auVar108._16_4_ * 0.0;
        auVar101._20_4_ = auVar108._20_4_ * 0.0;
        auVar101._24_4_ = auVar108._24_4_ * 0.0;
        auVar101._28_4_ = iVar2;
        auVar90 = vfmsub231ps_fma(auVar101,auVar109,auVar98);
        auVar102._4_4_ = fVar133 * auVar98._4_4_;
        auVar102._0_4_ = fVar85 * auVar98._0_4_;
        auVar102._8_4_ = fVar135 * auVar98._8_4_;
        auVar102._12_4_ = fVar137 * auVar98._12_4_;
        auVar102._16_4_ = auVar98._16_4_ * 0.0;
        auVar102._20_4_ = auVar98._20_4_ * 0.0;
        auVar102._24_4_ = auVar98._24_4_ * 0.0;
        auVar102._28_4_ = auVar110._28_4_;
        auVar89 = vfmsub231ps_fma(auVar102,auVar106,auVar112);
        auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar111,ZEXT1632(auVar90));
        auVar172._0_4_ = auVar112._0_4_ * auVar109._0_4_;
        auVar172._4_4_ = auVar112._4_4_ * auVar109._4_4_;
        auVar172._8_4_ = auVar112._8_4_ * auVar109._8_4_;
        auVar172._12_4_ = auVar112._12_4_ * auVar109._12_4_;
        auVar172._16_4_ = auVar112._16_4_ * fVar178;
        auVar172._20_4_ = auVar112._20_4_ * fVar168;
        auVar172._24_4_ = auVar112._24_4_ * fVar179;
        auVar172._28_4_ = 0;
        auVar90 = vfmsub231ps_fma(auVar172,auVar97,auVar108);
        auVar99 = vfmadd231ps_avx512vl(auVar110,auVar111,ZEXT1632(auVar90));
        auVar110 = vmulps_avx512vl(auVar96,auVar116);
        auVar110 = vfmsub231ps_avx512vl(auVar110,auVar107,auVar118);
        auVar105._4_4_ = auVar95._4_4_ * auVar118._4_4_;
        auVar105._0_4_ = auVar95._0_4_ * auVar118._0_4_;
        auVar105._8_4_ = auVar95._8_4_ * auVar118._8_4_;
        auVar105._12_4_ = auVar95._12_4_ * auVar118._12_4_;
        auVar105._16_4_ = auVar95._16_4_ * auVar118._16_4_;
        auVar105._20_4_ = auVar95._20_4_ * auVar118._20_4_;
        auVar105._24_4_ = auVar95._24_4_ * auVar118._24_4_;
        auVar105._28_4_ = auVar118._28_4_;
        auVar90 = vfmsub231ps_fma(auVar105,auVar117,auVar96);
        auVar173._0_4_ = auVar117._0_4_ * auVar107._0_4_;
        auVar173._4_4_ = auVar117._4_4_ * auVar107._4_4_;
        auVar173._8_4_ = auVar117._8_4_ * auVar107._8_4_;
        auVar173._12_4_ = auVar117._12_4_ * auVar107._12_4_;
        auVar173._16_4_ = fVar180 * auVar107._16_4_;
        auVar173._20_4_ = fVar161 * auVar107._20_4_;
        auVar173._24_4_ = fVar167 * auVar107._24_4_;
        auVar173._28_4_ = 0;
        auVar89 = vfmsub231ps_fma(auVar173,auVar95,auVar116);
        auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar111,auVar110);
        auVar101 = vfmadd231ps_avx512vl(auVar110,auVar111,ZEXT1632(auVar90));
        auVar110 = vmaxps_avx(auVar99,auVar101);
        uVar140 = vcmpps_avx512vl(auVar110,auVar111,2);
        local_370 = local_370 & (byte)uVar140;
        auVar210 = ZEXT3264(local_560);
        auVar211 = ZEXT3264(local_500);
        auVar212 = ZEXT3264(local_580);
        auVar209 = ZEXT3264(local_6e0);
        auVar204 = ZEXT1664(_local_770);
        if (local_370 == 0) {
          local_370 = 0;
        }
        else {
          auVar39._4_4_ = auVar96._4_4_ * auVar112._4_4_;
          auVar39._0_4_ = auVar96._0_4_ * auVar112._0_4_;
          auVar39._8_4_ = auVar96._8_4_ * auVar112._8_4_;
          auVar39._12_4_ = auVar96._12_4_ * auVar112._12_4_;
          auVar39._16_4_ = auVar96._16_4_ * auVar112._16_4_;
          auVar39._20_4_ = auVar96._20_4_ * auVar112._20_4_;
          auVar39._24_4_ = auVar96._24_4_ * auVar112._24_4_;
          auVar39._28_4_ = auVar110._28_4_;
          auVar91 = vfmsub231ps_fma(auVar39,auVar95,auVar108);
          auVar40._4_4_ = auVar108._4_4_ * auVar107._4_4_;
          auVar40._0_4_ = auVar108._0_4_ * auVar107._0_4_;
          auVar40._8_4_ = auVar108._8_4_ * auVar107._8_4_;
          auVar40._12_4_ = auVar108._12_4_ * auVar107._12_4_;
          auVar40._16_4_ = auVar108._16_4_ * auVar107._16_4_;
          auVar40._20_4_ = auVar108._20_4_ * auVar107._20_4_;
          auVar40._24_4_ = auVar108._24_4_ * auVar107._24_4_;
          auVar40._28_4_ = auVar108._28_4_;
          auVar89 = vfmsub231ps_fma(auVar40,auVar98,auVar96);
          auVar41._4_4_ = auVar95._4_4_ * auVar98._4_4_;
          auVar41._0_4_ = auVar95._0_4_ * auVar98._0_4_;
          auVar41._8_4_ = auVar95._8_4_ * auVar98._8_4_;
          auVar41._12_4_ = auVar95._12_4_ * auVar98._12_4_;
          auVar41._16_4_ = auVar95._16_4_ * auVar98._16_4_;
          auVar41._20_4_ = auVar95._20_4_ * auVar98._20_4_;
          auVar41._24_4_ = auVar95._24_4_ * auVar98._24_4_;
          auVar41._28_4_ = auVar95._28_4_;
          auVar19 = vfmsub231ps_fma(auVar41,auVar107,auVar112);
          auVar90 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar89),ZEXT1632(auVar19));
          auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar91),auVar111);
          auVar112 = vrcp14ps_avx512vl(auVar110);
          auVar32._8_4_ = 0x3f800000;
          auVar32._0_8_ = &DAT_3f8000003f800000;
          auVar32._12_4_ = 0x3f800000;
          auVar32._16_4_ = 0x3f800000;
          auVar32._20_4_ = 0x3f800000;
          auVar32._24_4_ = 0x3f800000;
          auVar32._28_4_ = 0x3f800000;
          auVar108 = vfnmadd213ps_avx512vl(auVar112,auVar110,auVar32);
          auVar90 = vfmadd132ps_fma(auVar108,auVar112,auVar112);
          auVar42._4_4_ = auVar19._4_4_ * auVar109._4_4_;
          auVar42._0_4_ = auVar19._0_4_ * auVar109._0_4_;
          auVar42._8_4_ = auVar19._8_4_ * auVar109._8_4_;
          auVar42._12_4_ = auVar19._12_4_ * auVar109._12_4_;
          auVar42._16_4_ = fVar178 * 0.0;
          auVar42._20_4_ = fVar168 * 0.0;
          auVar42._24_4_ = fVar179 * 0.0;
          auVar42._28_4_ = iVar1;
          auVar89 = vfmadd231ps_fma(auVar42,auVar97,ZEXT1632(auVar89));
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar106,ZEXT1632(auVar91));
          fVar168 = auVar90._0_4_;
          fVar178 = auVar90._4_4_;
          fVar179 = auVar90._8_4_;
          fVar180 = auVar90._12_4_;
          auVar112 = ZEXT1632(CONCAT412(auVar89._12_4_ * fVar180,
                                        CONCAT48(auVar89._8_4_ * fVar179,
                                                 CONCAT44(auVar89._4_4_ * fVar178,
                                                          auVar89._0_4_ * fVar168))));
          auVar194._4_4_ = fVar169;
          auVar194._0_4_ = fVar169;
          auVar194._8_4_ = fVar169;
          auVar194._12_4_ = fVar169;
          auVar194._16_4_ = fVar169;
          auVar194._20_4_ = fVar169;
          auVar194._24_4_ = fVar169;
          auVar194._28_4_ = fVar169;
          uVar140 = vcmpps_avx512vl(auVar194,auVar112,2);
          uVar139 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar33._4_4_ = uVar139;
          auVar33._0_4_ = uVar139;
          auVar33._8_4_ = uVar139;
          auVar33._12_4_ = uVar139;
          auVar33._16_4_ = uVar139;
          auVar33._20_4_ = uVar139;
          auVar33._24_4_ = uVar139;
          auVar33._28_4_ = uVar139;
          uVar25 = vcmpps_avx512vl(auVar112,auVar33,2);
          local_370 = (byte)uVar140 & (byte)uVar25 & local_370;
          if (local_370 != 0) {
            uVar140 = vcmpps_avx512vl(auVar110,auVar111,4);
            if ((local_370 & (byte)uVar140) != 0) {
              local_370 = local_370 & (byte)uVar140;
              fVar161 = auVar99._0_4_ * fVar168;
              fVar167 = auVar99._4_4_ * fVar178;
              auVar43._4_4_ = fVar167;
              auVar43._0_4_ = fVar161;
              fVar84 = auVar99._8_4_ * fVar179;
              auVar43._8_4_ = fVar84;
              fVar85 = auVar99._12_4_ * fVar180;
              auVar43._12_4_ = fVar85;
              fVar132 = auVar99._16_4_ * 0.0;
              auVar43._16_4_ = fVar132;
              fVar133 = auVar99._20_4_ * 0.0;
              auVar43._20_4_ = fVar133;
              fVar134 = auVar99._24_4_ * 0.0;
              auVar43._24_4_ = fVar134;
              auVar43._28_4_ = auVar99._28_4_;
              fVar168 = auVar101._0_4_ * fVar168;
              fVar178 = auVar101._4_4_ * fVar178;
              auVar44._4_4_ = fVar178;
              auVar44._0_4_ = fVar168;
              fVar179 = auVar101._8_4_ * fVar179;
              auVar44._8_4_ = fVar179;
              fVar180 = auVar101._12_4_ * fVar180;
              auVar44._12_4_ = fVar180;
              fVar135 = auVar101._16_4_ * 0.0;
              auVar44._16_4_ = fVar135;
              fVar136 = auVar101._20_4_ * 0.0;
              auVar44._20_4_ = fVar136;
              fVar137 = auVar101._24_4_ * 0.0;
              auVar44._24_4_ = fVar137;
              auVar44._28_4_ = auVar101._28_4_;
              auVar186._8_4_ = 0x3f800000;
              auVar186._0_8_ = &DAT_3f8000003f800000;
              auVar186._12_4_ = 0x3f800000;
              auVar186._16_4_ = 0x3f800000;
              auVar186._20_4_ = 0x3f800000;
              auVar186._24_4_ = 0x3f800000;
              auVar186._28_4_ = 0x3f800000;
              auVar110 = vsubps_avx(auVar186,auVar43);
              local_720._0_4_ =
                   (uint)(bVar76 & 1) * (int)fVar161 | (uint)!(bool)(bVar76 & 1) * auVar110._0_4_;
              bVar80 = (bool)((byte)(uVar74 >> 1) & 1);
              local_720._4_4_ = (uint)bVar80 * (int)fVar167 | (uint)!bVar80 * auVar110._4_4_;
              bVar80 = (bool)((byte)(uVar74 >> 2) & 1);
              local_720._8_4_ = (uint)bVar80 * (int)fVar84 | (uint)!bVar80 * auVar110._8_4_;
              bVar80 = (bool)((byte)(uVar74 >> 3) & 1);
              local_720._12_4_ = (uint)bVar80 * (int)fVar85 | (uint)!bVar80 * auVar110._12_4_;
              bVar80 = (bool)((byte)(uVar74 >> 4) & 1);
              local_720._16_4_ = (uint)bVar80 * (int)fVar132 | (uint)!bVar80 * auVar110._16_4_;
              bVar80 = (bool)((byte)(uVar74 >> 5) & 1);
              local_720._20_4_ = (uint)bVar80 * (int)fVar133 | (uint)!bVar80 * auVar110._20_4_;
              bVar80 = (bool)((byte)(uVar74 >> 6) & 1);
              local_720._24_4_ = (uint)bVar80 * (int)fVar134 | (uint)!bVar80 * auVar110._24_4_;
              bVar80 = SUB81(uVar74 >> 7,0);
              local_720._28_4_ = (uint)bVar80 * auVar99._28_4_ | (uint)!bVar80 * auVar110._28_4_;
              auVar110 = vsubps_avx(auVar186,auVar44);
              bVar80 = (bool)((byte)(uVar74 >> 1) & 1);
              bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
              bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
              bVar14 = (bool)((byte)(uVar74 >> 4) & 1);
              bVar15 = (bool)((byte)(uVar74 >> 5) & 1);
              bVar16 = (bool)((byte)(uVar74 >> 6) & 1);
              bVar17 = SUB81(uVar74 >> 7,0);
              local_2e0._4_4_ = (uint)bVar80 * (int)fVar178 | (uint)!bVar80 * auVar110._4_4_;
              local_2e0._0_4_ =
                   (uint)(bVar76 & 1) * (int)fVar168 | (uint)!(bool)(bVar76 & 1) * auVar110._0_4_;
              local_2e0._8_4_ = (uint)bVar12 * (int)fVar179 | (uint)!bVar12 * auVar110._8_4_;
              local_2e0._12_4_ = (uint)bVar13 * (int)fVar180 | (uint)!bVar13 * auVar110._12_4_;
              local_2e0._16_4_ = (uint)bVar14 * (int)fVar135 | (uint)!bVar14 * auVar110._16_4_;
              local_2e0._20_4_ = (uint)bVar15 * (int)fVar136 | (uint)!bVar15 * auVar110._20_4_;
              local_2e0._24_4_ = (uint)bVar16 * (int)fVar137 | (uint)!bVar16 * auVar110._24_4_;
              local_2e0._28_4_ = (uint)bVar17 * auVar101._28_4_ | (uint)!bVar17 * auVar110._28_4_;
              local_740 = auVar112;
              goto LAB_01c15ab2;
            }
          }
          local_370 = 0;
        }
LAB_01c15ab2:
        auVar216 = ZEXT3264(local_600);
        auVar215 = ZEXT3264(local_5e0);
        auVar214 = ZEXT3264(local_5c0);
        auVar208 = ZEXT3264(auVar100);
        if (local_370 != 0) {
          auVar110 = vsubps_avx(ZEXT1632(auVar24),auVar103);
          auVar90 = vfmadd213ps_fma(auVar110,local_720,auVar103);
          uVar139 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar103._4_4_ = uVar139;
          auVar103._0_4_ = uVar139;
          auVar103._8_4_ = uVar139;
          auVar103._12_4_ = uVar139;
          auVar103._16_4_ = uVar139;
          auVar103._20_4_ = uVar139;
          auVar103._24_4_ = uVar139;
          auVar103._28_4_ = uVar139;
          auVar110 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar90._12_4_ + auVar90._12_4_,
                                                        CONCAT48(auVar90._8_4_ + auVar90._8_4_,
                                                                 CONCAT44(auVar90._4_4_ +
                                                                          auVar90._4_4_,
                                                                          auVar90._0_4_ +
                                                                          auVar90._0_4_)))),auVar103
                                    );
          uVar140 = vcmpps_avx512vl(local_740,auVar110,6);
          local_370 = local_370 & (byte)uVar140;
          if (local_370 != 0) {
            auVar149._8_4_ = 0xbf800000;
            auVar149._0_8_ = 0xbf800000bf800000;
            auVar149._12_4_ = 0xbf800000;
            auVar149._16_4_ = 0xbf800000;
            auVar149._20_4_ = 0xbf800000;
            auVar149._24_4_ = 0xbf800000;
            auVar149._28_4_ = 0xbf800000;
            auVar34._8_4_ = 0x40000000;
            auVar34._0_8_ = 0x4000000040000000;
            auVar34._12_4_ = 0x40000000;
            auVar34._16_4_ = 0x40000000;
            auVar34._20_4_ = 0x40000000;
            auVar34._24_4_ = 0x40000000;
            auVar34._28_4_ = 0x40000000;
            local_400 = vfmadd132ps_avx512vl(local_2e0,auVar149,auVar34);
            local_2e0 = local_400;
            auVar110 = local_2e0;
            local_3c0 = 0;
            local_3b0 = local_750._0_8_;
            uStack_3a8 = local_750._8_8_;
            local_3a0 = local_510._0_8_;
            uStack_398 = local_510._8_8_;
            local_390 = local_520._0_8_;
            uStack_388 = local_520._8_8_;
            local_380 = local_530._0_8_;
            uStack_378 = local_530._8_8_;
            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar80 = true, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar151 = 1.0 / auVar104._0_4_;
                local_360[0] = fVar151 * (local_720._0_4_ + 0.0);
                local_360[1] = fVar151 * (local_720._4_4_ + 1.0);
                local_360[2] = fVar151 * (local_720._8_4_ + 2.0);
                local_360[3] = fVar151 * (local_720._12_4_ + 3.0);
                fStack_350 = fVar151 * (local_720._16_4_ + 4.0);
                fStack_34c = fVar151 * (local_720._20_4_ + 5.0);
                fStack_348 = fVar151 * (local_720._24_4_ + 6.0);
                fStack_344 = local_720._28_4_ + 7.0;
                local_2e0._0_8_ = local_400._0_8_;
                local_2e0._8_8_ = local_400._8_8_;
                local_2e0._16_8_ = local_400._16_8_;
                local_2e0._24_8_ = local_400._24_8_;
                local_340 = local_2e0._0_8_;
                uStack_338 = local_2e0._8_8_;
                uStack_330 = local_2e0._16_8_;
                uStack_328 = local_2e0._24_8_;
                local_320 = local_740;
                local_4a0 = 0;
                uVar79 = (ulong)local_370;
                for (uVar74 = uVar79; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000)
                {
                  local_4a0 = local_4a0 + 1;
                }
                local_4c0 = vpbroadcastd_avx512vl();
                local_760 = local_510._0_4_;
                uStack_75c = local_510._4_4_;
                uStack_758 = local_510._8_8_;
                local_4e0 = vpbroadcastd_avx512vl();
                local_680 = local_520._0_8_;
                uStack_678 = local_520._8_8_;
                local_690 = local_530._0_4_;
                fStack_68c = local_530._4_4_;
                fStack_688 = local_530._8_4_;
                fStack_684 = local_530._12_4_;
                bVar80 = true;
                local_620 = fVar169;
                local_5a0 = auVar100;
                local_420 = local_720;
                local_3e0 = local_740;
                local_3bc = iVar7;
                local_2e0 = auVar110;
                do {
                  auVar91 = auVar213._0_16_;
                  uVar139 = *(undefined4 *)(ray + k * 4 + 0x100);
                  local_220 = local_360[local_4a0];
                  local_200 = *(undefined4 *)((long)&local_340 + local_4a0 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + local_4a0 * 4);
                  local_7a0.context = context->user;
                  fVar168 = 1.0 - local_220;
                  fVar151 = fVar168 * fVar168 * -3.0;
                  auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar168 * fVar168)),
                                            ZEXT416((uint)(local_220 * fVar168)),ZEXT416(0xc0000000)
                                           );
                  auVar89 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar168)),
                                            ZEXT416((uint)(local_220 * local_220)),
                                            ZEXT416(0x40000000));
                  fVar168 = auVar90._0_4_ * 3.0;
                  fVar178 = auVar89._0_4_ * 3.0;
                  fVar179 = local_220 * local_220 * 3.0;
                  auVar184._0_4_ = fVar179 * local_690;
                  auVar184._4_4_ = fVar179 * fStack_68c;
                  auVar184._8_4_ = fVar179 * fStack_688;
                  auVar184._12_4_ = fVar179 * fStack_684;
                  auVar145._4_4_ = fVar178;
                  auVar145._0_4_ = fVar178;
                  auVar145._8_4_ = fVar178;
                  auVar145._12_4_ = fVar178;
                  auVar70._8_8_ = uStack_678;
                  auVar70._0_8_ = local_680;
                  auVar90 = vfmadd132ps_fma(auVar145,auVar184,auVar70);
                  auVar164._4_4_ = fVar168;
                  auVar164._0_4_ = fVar168;
                  auVar164._8_4_ = fVar168;
                  auVar164._12_4_ = fVar168;
                  auVar64._4_4_ = uStack_75c;
                  auVar64._0_4_ = local_760;
                  auVar64._8_8_ = uStack_758;
                  auVar90 = vfmadd132ps_fma(auVar164,auVar90,auVar64);
                  auVar146._4_4_ = fVar151;
                  auVar146._0_4_ = fVar151;
                  auVar146._8_4_ = fVar151;
                  auVar146._12_4_ = fVar151;
                  auVar90 = vfmadd132ps_fma(auVar146,auVar90,local_750);
                  local_280 = auVar90._0_4_;
                  auVar174._8_4_ = 1;
                  auVar174._0_8_ = 0x100000001;
                  auVar174._12_4_ = 1;
                  auVar174._16_4_ = 1;
                  auVar174._20_4_ = 1;
                  auVar174._24_4_ = 1;
                  auVar174._28_4_ = 1;
                  local_260 = vpermps_avx2(auVar174,ZEXT1632(auVar90));
                  auVar187._8_4_ = 2;
                  auVar187._0_8_ = 0x200000002;
                  auVar187._12_4_ = 2;
                  auVar187._16_4_ = 2;
                  auVar187._20_4_ = 2;
                  auVar187._24_4_ = 2;
                  auVar187._28_4_ = 2;
                  local_240 = vpermps_avx2(auVar187,ZEXT1632(auVar90));
                  uStack_27c = local_280;
                  uStack_278 = local_280;
                  uStack_274 = local_280;
                  uStack_270 = local_280;
                  uStack_26c = local_280;
                  uStack_268 = local_280;
                  uStack_264 = local_280;
                  fStack_21c = local_220;
                  fStack_218 = local_220;
                  fStack_214 = local_220;
                  fStack_210 = local_220;
                  fStack_20c = local_220;
                  fStack_208 = local_220;
                  fStack_204 = local_220;
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = local_4e0._0_8_;
                  uStack_1d8 = local_4e0._8_8_;
                  uStack_1d0 = local_4e0._16_8_;
                  uStack_1c8 = local_4e0._24_8_;
                  local_1c0 = local_4c0;
                  vpcmpeqd_avx2(local_4c0,local_4c0);
                  local_1a0 = (local_7a0.context)->instID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_180 = (local_7a0.context)->instPrimID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_6c0 = local_2a0._0_8_;
                  uStack_6b8 = local_2a0._8_8_;
                  uStack_6b0 = local_2a0._16_8_;
                  uStack_6a8 = local_2a0._24_8_;
                  local_7a0.valid = (int *)&local_6c0;
                  local_7a0.geometryUserPtr = pGVar8->userPtr;
                  local_7a0.hit = (RTCHitN *)&local_280;
                  local_7a0.N = 8;
                  local_480 = (undefined4)uVar79;
                  uStack_47c = (undefined4)(uVar79 >> 0x20);
                  local_7a0.ray = (RTCRayN *)ray;
                  if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->occlusionFilterN)(&local_7a0);
                    uVar79 = CONCAT44(uStack_47c,local_480);
                    auVar204 = ZEXT1664(_local_770);
                    auVar208 = ZEXT3264(local_5a0);
                    auVar216 = ZEXT3264(local_600);
                    auVar215 = ZEXT3264(local_5e0);
                    auVar214 = ZEXT3264(local_5c0);
                    auVar217 = ZEXT3264(local_700);
                    auVar209 = ZEXT3264(local_6e0);
                    auVar212 = ZEXT3264(local_580);
                    auVar211 = ZEXT3264(local_500);
                    auVar210 = ZEXT3264(local_560);
                    auVar90 = vxorps_avx512vl(auVar91,auVar91);
                    auVar213 = ZEXT1664(auVar90);
                    fVar169 = local_620;
                  }
                  auVar90 = auVar213._0_16_;
                  auVar65._8_8_ = uStack_6b8;
                  auVar65._0_8_ = local_6c0;
                  auVar65._16_8_ = uStack_6b0;
                  auVar65._24_8_ = uStack_6a8;
                  if (auVar65 != (undefined1  [32])0x0) {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_7a0);
                      uVar79 = CONCAT44(uStack_47c,local_480);
                      auVar204 = ZEXT1664(_local_770);
                      auVar208 = ZEXT3264(local_5a0);
                      auVar216 = ZEXT3264(local_600);
                      auVar215 = ZEXT3264(local_5e0);
                      auVar214 = ZEXT3264(local_5c0);
                      auVar217 = ZEXT3264(local_700);
                      auVar209 = ZEXT3264(local_6e0);
                      auVar212 = ZEXT3264(local_580);
                      auVar211 = ZEXT3264(local_500);
                      auVar210 = ZEXT3264(local_560);
                      auVar90 = vxorps_avx512vl(auVar90,auVar90);
                      auVar213 = ZEXT1664(auVar90);
                      fVar169 = local_620;
                    }
                    auVar100 = auVar208._0_32_;
                    auVar66._8_8_ = uStack_6b8;
                    auVar66._0_8_ = local_6c0;
                    auVar66._16_8_ = uStack_6b0;
                    auVar66._24_8_ = uStack_6a8;
                    uVar74 = vptestmd_avx512vl(auVar66,auVar66);
                    auVar110 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar12 = (bool)((byte)uVar74 & 1);
                    auVar121._0_4_ =
                         (uint)bVar12 * auVar110._0_4_ |
                         (uint)!bVar12 * *(int *)(local_7a0.ray + 0x100);
                    bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                    auVar121._4_4_ =
                         (uint)bVar12 * auVar110._4_4_ |
                         (uint)!bVar12 * *(int *)(local_7a0.ray + 0x104);
                    bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
                    auVar121._8_4_ =
                         (uint)bVar12 * auVar110._8_4_ |
                         (uint)!bVar12 * *(int *)(local_7a0.ray + 0x108);
                    bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
                    auVar121._12_4_ =
                         (uint)bVar12 * auVar110._12_4_ |
                         (uint)!bVar12 * *(int *)(local_7a0.ray + 0x10c);
                    bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
                    auVar121._16_4_ =
                         (uint)bVar12 * auVar110._16_4_ |
                         (uint)!bVar12 * *(int *)(local_7a0.ray + 0x110);
                    bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
                    auVar121._20_4_ =
                         (uint)bVar12 * auVar110._20_4_ |
                         (uint)!bVar12 * *(int *)(local_7a0.ray + 0x114);
                    bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
                    auVar121._24_4_ =
                         (uint)bVar12 * auVar110._24_4_ |
                         (uint)!bVar12 * *(int *)(local_7a0.ray + 0x118);
                    bVar12 = SUB81(uVar74 >> 7,0);
                    auVar121._28_4_ =
                         (uint)bVar12 * auVar110._28_4_ |
                         (uint)!bVar12 * *(int *)(local_7a0.ray + 0x11c);
                    *(undefined1 (*) [32])(local_7a0.ray + 0x100) = auVar121;
                    fVar151 = auVar204._0_4_;
                    if (auVar66 != (undefined1  [32])0x0) break;
                  }
                  auVar100 = auVar208._0_32_;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar139;
                  uVar74 = local_4a0 & 0x3f;
                  local_4a0 = 0;
                  uVar79 = uVar79 ^ 1L << uVar74;
                  for (uVar74 = uVar79; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000
                      ) {
                    local_4a0 = local_4a0 + 1;
                  }
                  bVar80 = uVar79 != 0;
                  fVar151 = auVar204._0_4_;
                } while (bVar80);
              }
              goto LAB_01c160a3;
            }
          }
        }
        bVar80 = false;
      }
LAB_01c160a3:
      local_620 = fVar151;
      if (8 < iVar7) {
        auVar110 = vpbroadcastd_avx512vl();
        auVar204 = ZEXT3264(auVar110);
        fStack_498 = 1.0 / (float)local_460._0_4_;
        local_460 = vpbroadcastd_avx512vl();
        local_440 = vpbroadcastd_avx512vl();
        lVar82 = 8;
        fStack_61c = local_620;
        fStack_618 = local_620;
        fStack_614 = local_620;
        fStack_610 = local_620;
        fStack_60c = local_620;
        fStack_608 = local_620;
        fStack_604 = local_620;
        local_5a0 = auVar100;
        fStack_494 = fStack_498;
        fStack_490 = fStack_498;
        fStack_48c = fStack_498;
        fStack_488 = fStack_498;
        fStack_484 = fStack_498;
        local_480 = fVar169;
        uStack_47c = fVar169;
        uStack_478 = fVar169;
        uStack_474 = fVar169;
        uStack_470 = fVar169;
        uStack_46c = fVar169;
        uStack_468 = fVar169;
        uStack_464 = fVar169;
        local_4a0._0_4_ = fStack_498;
        local_4a0._4_4_ = fStack_498;
        do {
          auVar110 = vpbroadcastd_avx512vl();
          auVar95 = vpor_avx2(auVar110,_DAT_0205a920);
          uVar25 = vpcmpgtd_avx512vl(auVar204._0_32_,auVar95);
          auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar82 * 4 + lVar26);
          auVar112 = *(undefined1 (*) [32])(lVar26 + 0x2227768 + lVar82 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar26 + 0x2227bec + lVar82 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar26 + 0x2228070 + lVar82 * 4);
          local_5e0 = auVar215._0_32_;
          auVar96 = vmulps_avx512vl(local_5e0,auVar107);
          local_600 = auVar216._0_32_;
          auVar106 = vmulps_avx512vl(local_600,auVar107);
          auVar45._4_4_ = auVar107._4_4_ * (float)local_e0._4_4_;
          auVar45._0_4_ = auVar107._0_4_ * (float)local_e0._0_4_;
          auVar45._8_4_ = auVar107._8_4_ * fStack_d8;
          auVar45._12_4_ = auVar107._12_4_ * fStack_d4;
          auVar45._16_4_ = auVar107._16_4_ * fStack_d0;
          auVar45._20_4_ = auVar107._20_4_ * fStack_cc;
          auVar45._24_4_ = auVar107._24_4_ * fStack_c8;
          auVar45._28_4_ = auVar95._28_4_;
          auVar115 = auVar217._0_32_;
          auVar95 = vfmadd231ps_avx512vl(auVar96,auVar108,auVar115);
          local_5c0 = auVar214._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar106,auVar108,local_5c0);
          auVar106 = vfmadd231ps_avx512vl(auVar45,auVar108,local_c0);
          auVar114 = auVar212._0_32_;
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar112,auVar114);
          auVar111 = auVar209._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar112,auVar111);
          auVar90 = vfmadd231ps_fma(auVar106,auVar112,local_a0);
          auVar113 = auVar210._0_32_;
          auVar99 = vfmadd231ps_avx512vl(auVar95,auVar110,auVar113);
          local_500 = auVar211._0_32_;
          auVar101 = vfmadd231ps_avx512vl(auVar96,auVar110,local_500);
          auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar82 * 4 + lVar26);
          auVar96 = *(undefined1 (*) [32])(lVar26 + 0x2229b88 + lVar82 * 4);
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar110,local_80);
          auVar106 = *(undefined1 (*) [32])(lVar26 + 0x222a00c + lVar82 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar26 + 0x222a490 + lVar82 * 4);
          auVar100 = vmulps_avx512vl(local_5e0,auVar97);
          auVar98 = vmulps_avx512vl(local_600,auVar97);
          auVar46._4_4_ = auVar97._4_4_ * (float)local_e0._4_4_;
          auVar46._0_4_ = auVar97._0_4_ * (float)local_e0._0_4_;
          auVar46._8_4_ = auVar97._8_4_ * fStack_d8;
          auVar46._12_4_ = auVar97._12_4_ * fStack_d4;
          auVar46._16_4_ = auVar97._16_4_ * fStack_d0;
          auVar46._20_4_ = auVar97._20_4_ * fStack_cc;
          auVar46._24_4_ = auVar97._24_4_ * fStack_c8;
          auVar46._28_4_ = uStack_c4;
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,auVar115);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar106,local_5c0);
          auVar102 = vfmadd231ps_avx512vl(auVar46,auVar106,local_c0);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,auVar114);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar96,auVar111);
          auVar89 = vfmadd231ps_fma(auVar102,auVar96,local_a0);
          auVar102 = vfmadd231ps_avx512vl(auVar100,auVar95,auVar113);
          auVar103 = vfmadd231ps_avx512vl(auVar98,auVar95,local_500);
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar95,local_80);
          auVar104 = vmaxps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar89));
          auVar100 = vsubps_avx(auVar102,auVar99);
          auVar98 = vsubps_avx(auVar103,auVar101);
          auVar105 = vmulps_avx512vl(auVar101,auVar100);
          auVar109 = vmulps_avx512vl(auVar99,auVar98);
          auVar105 = vsubps_avx512vl(auVar105,auVar109);
          auVar109 = vmulps_avx512vl(auVar98,auVar98);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar100,auVar100);
          auVar104 = vmulps_avx512vl(auVar104,auVar104);
          auVar104 = vmulps_avx512vl(auVar104,auVar109);
          auVar105 = vmulps_avx512vl(auVar105,auVar105);
          uVar140 = vcmpps_avx512vl(auVar105,auVar104,2);
          local_370 = (byte)uVar25 & (byte)uVar140;
          if (local_370 == 0) {
            auVar208 = ZEXT3264(auVar111);
            auVar217 = ZEXT3264(auVar115);
          }
          else {
            auVar97 = vmulps_avx512vl(local_5a0,auVar97);
            auVar106 = vfmadd213ps_avx512vl(auVar106,local_140,auVar97);
            auVar96 = vfmadd213ps_avx512vl(auVar96,local_120,auVar106);
            auVar95 = vfmadd213ps_avx512vl(auVar95,local_100,auVar96);
            auVar107 = vmulps_avx512vl(local_5a0,auVar107);
            auVar108 = vfmadd213ps_avx512vl(auVar108,local_140,auVar107);
            auVar112 = vfmadd213ps_avx512vl(auVar112,local_120,auVar108);
            auVar96 = vfmadd213ps_avx512vl(auVar110,local_100,auVar112);
            auVar110 = *(undefined1 (*) [32])(lVar26 + 0x22284f4 + lVar82 * 4);
            auVar112 = *(undefined1 (*) [32])(lVar26 + 0x2228978 + lVar82 * 4);
            auVar108 = *(undefined1 (*) [32])(lVar26 + 0x2228dfc + lVar82 * 4);
            auVar107 = *(undefined1 (*) [32])(lVar26 + 0x2229280 + lVar82 * 4);
            auVar106 = vmulps_avx512vl(local_5e0,auVar107);
            auVar97 = vmulps_avx512vl(local_600,auVar107);
            auVar107 = vmulps_avx512vl(local_5a0,auVar107);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar108,auVar115);
            auVar97 = vfmadd231ps_avx512vl(auVar97,auVar108,local_5c0);
            auVar108 = vfmadd231ps_avx512vl(auVar107,local_140,auVar108);
            auVar107 = vfmadd231ps_avx512vl(auVar106,auVar112,auVar114);
            auVar106 = vfmadd231ps_avx512vl(auVar97,auVar112,auVar111);
            auVar112 = vfmadd231ps_avx512vl(auVar108,local_120,auVar112);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar110,auVar113);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar110,local_500);
            auVar97 = vfmadd231ps_avx512vl(auVar112,local_100,auVar110);
            auVar110 = *(undefined1 (*) [32])(lVar26 + 0x222a914 + lVar82 * 4);
            auVar112 = *(undefined1 (*) [32])(lVar26 + 0x222b21c + lVar82 * 4);
            auVar108 = *(undefined1 (*) [32])(lVar26 + 0x222b6a0 + lVar82 * 4);
            auVar104 = vmulps_avx512vl(local_5e0,auVar108);
            auVar105 = vmulps_avx512vl(local_600,auVar108);
            auVar108 = vmulps_avx512vl(local_5a0,auVar108);
            auVar104 = vfmadd231ps_avx512vl(auVar104,auVar112,auVar115);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar112,local_5c0);
            auVar108 = vfmadd231ps_avx512vl(auVar108,local_140,auVar112);
            auVar112 = *(undefined1 (*) [32])(lVar26 + 0x222ad98 + lVar82 * 4);
            auVar104 = vfmadd231ps_avx512vl(auVar104,auVar112,auVar114);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar112,auVar111);
            auVar112 = vfmadd231ps_avx512vl(auVar108,local_120,auVar112);
            auVar108 = vfmadd231ps_avx512vl(auVar104,auVar110,auVar113);
            auVar104 = vfmadd231ps_avx512vl(auVar105,auVar110,local_500);
            auVar112 = vfmadd231ps_avx512vl(auVar112,local_100,auVar110);
            auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar107,auVar105);
            vandps_avx512vl(auVar106,auVar105);
            auVar110 = vmaxps_avx(auVar105,auVar105);
            vandps_avx512vl(auVar97,auVar105);
            auVar110 = vmaxps_avx(auVar110,auVar105);
            auVar72._4_4_ = fStack_61c;
            auVar72._0_4_ = local_620;
            auVar72._8_4_ = fStack_618;
            auVar72._12_4_ = fStack_614;
            auVar72._16_4_ = fStack_610;
            auVar72._20_4_ = fStack_60c;
            auVar72._24_4_ = fStack_608;
            auVar72._28_4_ = fStack_604;
            uVar74 = vcmpps_avx512vl(auVar110,auVar72,1);
            bVar12 = (bool)((byte)uVar74 & 1);
            auVar122._0_4_ = (float)((uint)bVar12 * auVar100._0_4_ | (uint)!bVar12 * auVar107._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar122._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar107._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar122._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar107._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar122._12_4_ =
                 (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar107._12_4_);
            bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
            auVar122._16_4_ =
                 (float)((uint)bVar12 * auVar100._16_4_ | (uint)!bVar12 * auVar107._16_4_);
            bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
            auVar122._20_4_ =
                 (float)((uint)bVar12 * auVar100._20_4_ | (uint)!bVar12 * auVar107._20_4_);
            bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
            auVar122._24_4_ =
                 (float)((uint)bVar12 * auVar100._24_4_ | (uint)!bVar12 * auVar107._24_4_);
            bVar12 = SUB81(uVar74 >> 7,0);
            auVar122._28_4_ = (uint)bVar12 * auVar100._28_4_ | (uint)!bVar12 * auVar107._28_4_;
            bVar12 = (bool)((byte)uVar74 & 1);
            auVar123._0_4_ = (float)((uint)bVar12 * auVar98._0_4_ | (uint)!bVar12 * auVar106._0_4_);
            bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar123._4_4_ = (float)((uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * auVar106._4_4_);
            bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar123._8_4_ = (float)((uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * auVar106._8_4_);
            bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar123._12_4_ =
                 (float)((uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * auVar106._12_4_);
            bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
            auVar123._16_4_ =
                 (float)((uint)bVar12 * auVar98._16_4_ | (uint)!bVar12 * auVar106._16_4_);
            bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
            auVar123._20_4_ =
                 (float)((uint)bVar12 * auVar98._20_4_ | (uint)!bVar12 * auVar106._20_4_);
            bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
            auVar123._24_4_ =
                 (float)((uint)bVar12 * auVar98._24_4_ | (uint)!bVar12 * auVar106._24_4_);
            bVar12 = SUB81(uVar74 >> 7,0);
            auVar123._28_4_ = (uint)bVar12 * auVar98._28_4_ | (uint)!bVar12 * auVar106._28_4_;
            vandps_avx512vl(auVar108,auVar105);
            vandps_avx512vl(auVar104,auVar105);
            auVar110 = vmaxps_avx(auVar123,auVar123);
            vandps_avx512vl(auVar112,auVar105);
            auVar110 = vmaxps_avx(auVar110,auVar123);
            uVar74 = vcmpps_avx512vl(auVar110,auVar72,1);
            bVar12 = (bool)((byte)uVar74 & 1);
            auVar124._0_4_ = (uint)bVar12 * auVar100._0_4_ | (uint)!bVar12 * auVar108._0_4_;
            bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar124._4_4_ = (uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar108._4_4_;
            bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar124._8_4_ = (uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar108._8_4_;
            bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar124._12_4_ = (uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar108._12_4_;
            bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
            auVar124._16_4_ = (uint)bVar12 * auVar100._16_4_ | (uint)!bVar12 * auVar108._16_4_;
            bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
            auVar124._20_4_ = (uint)bVar12 * auVar100._20_4_ | (uint)!bVar12 * auVar108._20_4_;
            bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
            auVar124._24_4_ = (uint)bVar12 * auVar100._24_4_ | (uint)!bVar12 * auVar108._24_4_;
            bVar12 = SUB81(uVar74 >> 7,0);
            auVar124._28_4_ = (uint)bVar12 * auVar100._28_4_ | (uint)!bVar12 * auVar108._28_4_;
            bVar12 = (bool)((byte)uVar74 & 1);
            auVar125._0_4_ = (float)((uint)bVar12 * auVar98._0_4_ | (uint)!bVar12 * auVar104._0_4_);
            bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar125._4_4_ = (float)((uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * auVar104._4_4_);
            bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar125._8_4_ = (float)((uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * auVar104._8_4_);
            bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar125._12_4_ =
                 (float)((uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * auVar104._12_4_);
            bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
            auVar125._16_4_ =
                 (float)((uint)bVar12 * auVar98._16_4_ | (uint)!bVar12 * auVar104._16_4_);
            bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
            auVar125._20_4_ =
                 (float)((uint)bVar12 * auVar98._20_4_ | (uint)!bVar12 * auVar104._20_4_);
            bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
            auVar125._24_4_ =
                 (float)((uint)bVar12 * auVar98._24_4_ | (uint)!bVar12 * auVar104._24_4_);
            bVar12 = SUB81(uVar74 >> 7,0);
            auVar125._28_4_ = (uint)bVar12 * auVar98._28_4_ | (uint)!bVar12 * auVar104._28_4_;
            auVar198._8_4_ = 0x80000000;
            auVar198._0_8_ = 0x8000000080000000;
            auVar198._12_4_ = 0x80000000;
            auVar198._16_4_ = 0x80000000;
            auVar198._20_4_ = 0x80000000;
            auVar198._24_4_ = 0x80000000;
            auVar198._28_4_ = 0x80000000;
            auVar110 = vxorps_avx512vl(auVar124,auVar198);
            auVar104 = auVar213._0_32_;
            auVar112 = vfmadd213ps_avx512vl(auVar122,auVar122,auVar104);
            auVar91 = vfmadd231ps_fma(auVar112,auVar123,auVar123);
            auVar112 = vrsqrt14ps_avx512vl(ZEXT1632(auVar91));
            auVar207._8_4_ = 0xbf000000;
            auVar207._0_8_ = 0xbf000000bf000000;
            auVar207._12_4_ = 0xbf000000;
            auVar207._16_4_ = 0xbf000000;
            auVar207._20_4_ = 0xbf000000;
            auVar207._24_4_ = 0xbf000000;
            auVar207._28_4_ = 0xbf000000;
            fVar169 = auVar112._0_4_;
            fVar151 = auVar112._4_4_;
            fVar168 = auVar112._8_4_;
            fVar178 = auVar112._12_4_;
            fVar179 = auVar112._16_4_;
            fVar180 = auVar112._20_4_;
            fVar161 = auVar112._24_4_;
            auVar47._4_4_ = fVar151 * fVar151 * fVar151 * auVar91._4_4_ * -0.5;
            auVar47._0_4_ = fVar169 * fVar169 * fVar169 * auVar91._0_4_ * -0.5;
            auVar47._8_4_ = fVar168 * fVar168 * fVar168 * auVar91._8_4_ * -0.5;
            auVar47._12_4_ = fVar178 * fVar178 * fVar178 * auVar91._12_4_ * -0.5;
            auVar47._16_4_ = fVar179 * fVar179 * fVar179 * -0.0;
            auVar47._20_4_ = fVar180 * fVar180 * fVar180 * -0.0;
            auVar47._24_4_ = fVar161 * fVar161 * fVar161 * -0.0;
            auVar47._28_4_ = auVar123._28_4_;
            auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar112 = vfmadd231ps_avx512vl(auVar47,auVar108,auVar112);
            auVar48._4_4_ = auVar123._4_4_ * auVar112._4_4_;
            auVar48._0_4_ = auVar123._0_4_ * auVar112._0_4_;
            auVar48._8_4_ = auVar123._8_4_ * auVar112._8_4_;
            auVar48._12_4_ = auVar123._12_4_ * auVar112._12_4_;
            auVar48._16_4_ = auVar123._16_4_ * auVar112._16_4_;
            auVar48._20_4_ = auVar123._20_4_ * auVar112._20_4_;
            auVar48._24_4_ = auVar123._24_4_ * auVar112._24_4_;
            auVar48._28_4_ = 0;
            auVar49._4_4_ = auVar112._4_4_ * -auVar122._4_4_;
            auVar49._0_4_ = auVar112._0_4_ * -auVar122._0_4_;
            auVar49._8_4_ = auVar112._8_4_ * -auVar122._8_4_;
            auVar49._12_4_ = auVar112._12_4_ * -auVar122._12_4_;
            auVar49._16_4_ = auVar112._16_4_ * -auVar122._16_4_;
            auVar49._20_4_ = auVar112._20_4_ * -auVar122._20_4_;
            auVar49._24_4_ = auVar112._24_4_ * -auVar122._24_4_;
            auVar49._28_4_ = auVar123._28_4_;
            auVar107 = vmulps_avx512vl(auVar112,auVar104);
            auVar112 = vfmadd213ps_avx512vl(auVar124,auVar124,auVar104);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar125,auVar125);
            auVar106 = vrsqrt14ps_avx512vl(auVar112);
            auVar112 = vmulps_avx512vl(auVar112,auVar207);
            fVar169 = auVar106._0_4_;
            fVar151 = auVar106._4_4_;
            fVar168 = auVar106._8_4_;
            fVar178 = auVar106._12_4_;
            fVar179 = auVar106._16_4_;
            fVar180 = auVar106._20_4_;
            fVar161 = auVar106._24_4_;
            auVar50._4_4_ = fVar151 * fVar151 * fVar151 * auVar112._4_4_;
            auVar50._0_4_ = fVar169 * fVar169 * fVar169 * auVar112._0_4_;
            auVar50._8_4_ = fVar168 * fVar168 * fVar168 * auVar112._8_4_;
            auVar50._12_4_ = fVar178 * fVar178 * fVar178 * auVar112._12_4_;
            auVar50._16_4_ = fVar179 * fVar179 * fVar179 * auVar112._16_4_;
            auVar50._20_4_ = fVar180 * fVar180 * fVar180 * auVar112._20_4_;
            auVar50._24_4_ = fVar161 * fVar161 * fVar161 * auVar112._24_4_;
            auVar50._28_4_ = auVar112._28_4_;
            auVar112 = vfmadd231ps_avx512vl(auVar50,auVar108,auVar106);
            auVar51._4_4_ = auVar125._4_4_ * auVar112._4_4_;
            auVar51._0_4_ = auVar125._0_4_ * auVar112._0_4_;
            auVar51._8_4_ = auVar125._8_4_ * auVar112._8_4_;
            auVar51._12_4_ = auVar125._12_4_ * auVar112._12_4_;
            auVar51._16_4_ = auVar125._16_4_ * auVar112._16_4_;
            auVar51._20_4_ = auVar125._20_4_ * auVar112._20_4_;
            auVar51._24_4_ = auVar125._24_4_ * auVar112._24_4_;
            auVar51._28_4_ = auVar106._28_4_;
            auVar52._4_4_ = auVar112._4_4_ * auVar110._4_4_;
            auVar52._0_4_ = auVar112._0_4_ * auVar110._0_4_;
            auVar52._8_4_ = auVar112._8_4_ * auVar110._8_4_;
            auVar52._12_4_ = auVar112._12_4_ * auVar110._12_4_;
            auVar52._16_4_ = auVar112._16_4_ * auVar110._16_4_;
            auVar52._20_4_ = auVar112._20_4_ * auVar110._20_4_;
            auVar52._24_4_ = auVar112._24_4_ * auVar110._24_4_;
            auVar52._28_4_ = auVar110._28_4_;
            auVar110 = vmulps_avx512vl(auVar112,auVar104);
            auVar91 = vfmadd213ps_fma(auVar48,ZEXT1632(auVar90),auVar99);
            auVar112 = ZEXT1632(auVar90);
            auVar19 = vfmadd213ps_fma(auVar49,auVar112,auVar101);
            auVar108 = vfmadd213ps_avx512vl(auVar107,auVar112,auVar96);
            auVar106 = vfmadd213ps_avx512vl(auVar51,ZEXT1632(auVar89),auVar102);
            auVar24 = vfnmadd213ps_fma(auVar48,auVar112,auVar99);
            auVar97 = ZEXT1632(auVar89);
            auVar20 = vfmadd213ps_fma(auVar52,auVar97,auVar103);
            auVar92 = vfnmadd213ps_fma(auVar49,auVar112,auVar101);
            auVar21 = vfmadd213ps_fma(auVar110,auVar97,auVar95);
            auVar101 = ZEXT1632(auVar90);
            auVar94 = vfnmadd231ps_fma(auVar96,auVar101,auVar107);
            auVar93 = vfnmadd213ps_fma(auVar51,auVar97,auVar102);
            auVar28 = vfnmadd213ps_fma(auVar52,auVar97,auVar103);
            auVar29 = vfnmadd231ps_fma(auVar95,ZEXT1632(auVar89),auVar110);
            auVar95 = vsubps_avx512vl(auVar106,ZEXT1632(auVar24));
            auVar110 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar92));
            auVar112 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar94));
            auVar53._4_4_ = auVar110._4_4_ * auVar94._4_4_;
            auVar53._0_4_ = auVar110._0_4_ * auVar94._0_4_;
            auVar53._8_4_ = auVar110._8_4_ * auVar94._8_4_;
            auVar53._12_4_ = auVar110._12_4_ * auVar94._12_4_;
            auVar53._16_4_ = auVar110._16_4_ * 0.0;
            auVar53._20_4_ = auVar110._20_4_ * 0.0;
            auVar53._24_4_ = auVar110._24_4_ * 0.0;
            auVar53._28_4_ = auVar107._28_4_;
            auVar90 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar92),auVar112);
            auVar54._4_4_ = auVar112._4_4_ * auVar24._4_4_;
            auVar54._0_4_ = auVar112._0_4_ * auVar24._0_4_;
            auVar54._8_4_ = auVar112._8_4_ * auVar24._8_4_;
            auVar54._12_4_ = auVar112._12_4_ * auVar24._12_4_;
            auVar54._16_4_ = auVar112._16_4_ * 0.0;
            auVar54._20_4_ = auVar112._20_4_ * 0.0;
            auVar54._24_4_ = auVar112._24_4_ * 0.0;
            auVar54._28_4_ = auVar112._28_4_;
            auVar22 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar94),auVar95);
            auVar55._4_4_ = auVar92._4_4_ * auVar95._4_4_;
            auVar55._0_4_ = auVar92._0_4_ * auVar95._0_4_;
            auVar55._8_4_ = auVar92._8_4_ * auVar95._8_4_;
            auVar55._12_4_ = auVar92._12_4_ * auVar95._12_4_;
            auVar55._16_4_ = auVar95._16_4_ * 0.0;
            auVar55._20_4_ = auVar95._20_4_ * 0.0;
            auVar55._24_4_ = auVar95._24_4_ * 0.0;
            auVar55._28_4_ = auVar95._28_4_;
            auVar23 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar24),auVar110);
            auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar23),auVar104,ZEXT1632(auVar22));
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar104,ZEXT1632(auVar90));
            uVar74 = vcmpps_avx512vl(auVar110,auVar104,2);
            bVar76 = (byte)uVar74;
            fVar85 = (float)((uint)(bVar76 & 1) * auVar91._0_4_ |
                            (uint)!(bool)(bVar76 & 1) * auVar93._0_4_);
            bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
            fVar133 = (float)((uint)bVar12 * auVar91._4_4_ | (uint)!bVar12 * auVar93._4_4_);
            bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
            fVar135 = (float)((uint)bVar12 * auVar91._8_4_ | (uint)!bVar12 * auVar93._8_4_);
            bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
            fVar137 = (float)((uint)bVar12 * auVar91._12_4_ | (uint)!bVar12 * auVar93._12_4_);
            auVar97 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar135,CONCAT44(fVar133,fVar85))));
            fVar132 = (float)((uint)(bVar76 & 1) * auVar19._0_4_ |
                             (uint)!(bool)(bVar76 & 1) * auVar28._0_4_);
            bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
            fVar134 = (float)((uint)bVar12 * auVar19._4_4_ | (uint)!bVar12 * auVar28._4_4_);
            bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
            fVar136 = (float)((uint)bVar12 * auVar19._8_4_ | (uint)!bVar12 * auVar28._8_4_);
            bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
            fVar138 = (float)((uint)bVar12 * auVar19._12_4_ | (uint)!bVar12 * auVar28._12_4_);
            auVar100 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar136,CONCAT44(fVar134,fVar132))));
            auVar126._0_4_ =
                 (float)((uint)(bVar76 & 1) * auVar108._0_4_ |
                        (uint)!(bool)(bVar76 & 1) * auVar29._0_4_);
            bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar126._4_4_ = (float)((uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar29._4_4_);
            bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar126._8_4_ = (float)((uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar29._8_4_);
            bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar126._12_4_ =
                 (float)((uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar29._12_4_);
            fVar169 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar108._16_4_);
            auVar126._16_4_ = fVar169;
            fVar151 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar108._20_4_);
            auVar126._20_4_ = fVar151;
            fVar168 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar108._24_4_);
            auVar126._24_4_ = fVar168;
            iVar1 = (uint)(byte)(uVar74 >> 7) * auVar108._28_4_;
            auVar126._28_4_ = iVar1;
            auVar110 = vblendmps_avx512vl(ZEXT1632(auVar24),auVar106);
            auVar127._0_4_ =
                 (uint)(bVar76 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar90._0_4_;
            bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar127._4_4_ = (uint)bVar12 * auVar110._4_4_ | (uint)!bVar12 * auVar90._4_4_;
            bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar127._8_4_ = (uint)bVar12 * auVar110._8_4_ | (uint)!bVar12 * auVar90._8_4_;
            bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar127._12_4_ = (uint)bVar12 * auVar110._12_4_ | (uint)!bVar12 * auVar90._12_4_;
            auVar127._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * auVar110._16_4_;
            auVar127._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * auVar110._20_4_;
            auVar127._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * auVar110._24_4_;
            auVar127._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar110._28_4_;
            auVar110 = vblendmps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar20));
            auVar128._0_4_ =
                 (float)((uint)(bVar76 & 1) * auVar110._0_4_ |
                        (uint)!(bool)(bVar76 & 1) * auVar91._0_4_);
            bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar128._4_4_ = (float)((uint)bVar12 * auVar110._4_4_ | (uint)!bVar12 * auVar91._4_4_);
            bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar128._8_4_ = (float)((uint)bVar12 * auVar110._8_4_ | (uint)!bVar12 * auVar91._8_4_);
            bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar128._12_4_ =
                 (float)((uint)bVar12 * auVar110._12_4_ | (uint)!bVar12 * auVar91._12_4_);
            fVar178 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar110._16_4_);
            auVar128._16_4_ = fVar178;
            fVar179 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar110._20_4_);
            auVar128._20_4_ = fVar179;
            fVar180 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar110._24_4_);
            auVar128._24_4_ = fVar180;
            auVar128._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar110._28_4_;
            auVar110 = vblendmps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar21));
            auVar129._0_4_ =
                 (float)((uint)(bVar76 & 1) * auVar110._0_4_ |
                        (uint)!(bool)(bVar76 & 1) * auVar19._0_4_);
            bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar12 * auVar110._4_4_ | (uint)!bVar12 * auVar19._4_4_);
            bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar12 * auVar110._8_4_ | (uint)!bVar12 * auVar19._8_4_);
            bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar12 * auVar110._12_4_ | (uint)!bVar12 * auVar19._12_4_);
            fVar84 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar110._16_4_);
            auVar129._16_4_ = fVar84;
            fVar161 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar110._20_4_);
            auVar129._20_4_ = fVar161;
            fVar167 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar110._24_4_);
            auVar129._24_4_ = fVar167;
            iVar2 = (uint)(byte)(uVar74 >> 7) * auVar110._28_4_;
            auVar129._28_4_ = iVar2;
            auVar130._0_4_ =
                 (uint)(bVar76 & 1) * (int)auVar24._0_4_ |
                 (uint)!(bool)(bVar76 & 1) * auVar106._0_4_;
            bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar130._4_4_ = (uint)bVar12 * (int)auVar24._4_4_ | (uint)!bVar12 * auVar106._4_4_;
            bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar130._8_4_ = (uint)bVar12 * (int)auVar24._8_4_ | (uint)!bVar12 * auVar106._8_4_;
            bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar130._12_4_ = (uint)bVar12 * (int)auVar24._12_4_ | (uint)!bVar12 * auVar106._12_4_;
            auVar130._16_4_ = (uint)!(bool)((byte)(uVar74 >> 4) & 1) * auVar106._16_4_;
            auVar130._20_4_ = (uint)!(bool)((byte)(uVar74 >> 5) & 1) * auVar106._20_4_;
            auVar130._24_4_ = (uint)!(bool)((byte)(uVar74 >> 6) & 1) * auVar106._24_4_;
            auVar130._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar106._28_4_;
            bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar74 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar74 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar106 = vsubps_avx512vl(auVar130,auVar97);
            auVar112 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar92._12_4_ |
                                                     (uint)!bVar16 * auVar20._12_4_,
                                                     CONCAT48((uint)bVar14 * (int)auVar92._8_4_ |
                                                              (uint)!bVar14 * auVar20._8_4_,
                                                              CONCAT44((uint)bVar12 *
                                                                       (int)auVar92._4_4_ |
                                                                       (uint)!bVar12 * auVar20._4_4_
                                                                       ,(uint)(bVar76 & 1) *
                                                                        (int)auVar92._0_4_ |
                                                                        (uint)!(bool)(bVar76 & 1) *
                                                                        auVar20._0_4_)))),auVar100);
            auVar108 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar94._12_4_ |
                                                     (uint)!bVar17 * auVar21._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar94._8_4_ |
                                                              (uint)!bVar15 * auVar21._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar94._4_4_ |
                                                                       (uint)!bVar13 * auVar21._4_4_
                                                                       ,(uint)(bVar76 & 1) *
                                                                        (int)auVar94._0_4_ |
                                                                        (uint)!(bool)(bVar76 & 1) *
                                                                        auVar21._0_4_)))),auVar126);
            auVar107 = vsubps_avx(auVar97,auVar127);
            auVar95 = vsubps_avx(auVar100,auVar128);
            auVar96 = vsubps_avx(auVar126,auVar129);
            auVar56._4_4_ = auVar108._4_4_ * fVar133;
            auVar56._0_4_ = auVar108._0_4_ * fVar85;
            auVar56._8_4_ = auVar108._8_4_ * fVar135;
            auVar56._12_4_ = auVar108._12_4_ * fVar137;
            auVar56._16_4_ = auVar108._16_4_ * 0.0;
            auVar56._20_4_ = auVar108._20_4_ * 0.0;
            auVar56._24_4_ = auVar108._24_4_ * 0.0;
            auVar56._28_4_ = 0;
            auVar90 = vfmsub231ps_fma(auVar56,auVar126,auVar106);
            auVar166._0_4_ = fVar132 * auVar106._0_4_;
            auVar166._4_4_ = fVar134 * auVar106._4_4_;
            auVar166._8_4_ = fVar136 * auVar106._8_4_;
            auVar166._12_4_ = fVar138 * auVar106._12_4_;
            auVar166._16_4_ = auVar106._16_4_ * 0.0;
            auVar166._20_4_ = auVar106._20_4_ * 0.0;
            auVar166._24_4_ = auVar106._24_4_ * 0.0;
            auVar166._28_4_ = 0;
            auVar91 = vfmsub231ps_fma(auVar166,auVar97,auVar112);
            auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar104,ZEXT1632(auVar90));
            auVar175._0_4_ = auVar112._0_4_ * auVar126._0_4_;
            auVar175._4_4_ = auVar112._4_4_ * auVar126._4_4_;
            auVar175._8_4_ = auVar112._8_4_ * auVar126._8_4_;
            auVar175._12_4_ = auVar112._12_4_ * auVar126._12_4_;
            auVar175._16_4_ = auVar112._16_4_ * fVar169;
            auVar175._20_4_ = auVar112._20_4_ * fVar151;
            auVar175._24_4_ = auVar112._24_4_ * fVar168;
            auVar175._28_4_ = 0;
            auVar90 = vfmsub231ps_fma(auVar175,auVar100,auVar108);
            auVar98 = vfmadd231ps_avx512vl(auVar110,auVar104,ZEXT1632(auVar90));
            auVar110 = vmulps_avx512vl(auVar96,auVar127);
            auVar110 = vfmsub231ps_avx512vl(auVar110,auVar107,auVar129);
            auVar57._4_4_ = auVar95._4_4_ * auVar129._4_4_;
            auVar57._0_4_ = auVar95._0_4_ * auVar129._0_4_;
            auVar57._8_4_ = auVar95._8_4_ * auVar129._8_4_;
            auVar57._12_4_ = auVar95._12_4_ * auVar129._12_4_;
            auVar57._16_4_ = auVar95._16_4_ * fVar84;
            auVar57._20_4_ = auVar95._20_4_ * fVar161;
            auVar57._24_4_ = auVar95._24_4_ * fVar167;
            auVar57._28_4_ = iVar2;
            auVar90 = vfmsub231ps_fma(auVar57,auVar128,auVar96);
            auVar176._0_4_ = auVar128._0_4_ * auVar107._0_4_;
            auVar176._4_4_ = auVar128._4_4_ * auVar107._4_4_;
            auVar176._8_4_ = auVar128._8_4_ * auVar107._8_4_;
            auVar176._12_4_ = auVar128._12_4_ * auVar107._12_4_;
            auVar176._16_4_ = fVar178 * auVar107._16_4_;
            auVar176._20_4_ = fVar179 * auVar107._20_4_;
            auVar176._24_4_ = fVar180 * auVar107._24_4_;
            auVar176._28_4_ = 0;
            auVar91 = vfmsub231ps_fma(auVar176,auVar95,auVar127);
            auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar104,auVar110);
            auVar99 = vfmadd231ps_avx512vl(auVar110,auVar104,ZEXT1632(auVar90));
            auVar110 = vmaxps_avx(auVar98,auVar99);
            uVar140 = vcmpps_avx512vl(auVar110,auVar104,2);
            local_370 = local_370 & (byte)uVar140;
            if (local_370 == 0) {
LAB_01c16c96:
              local_370 = 0;
            }
            else {
              auVar58._4_4_ = auVar96._4_4_ * auVar112._4_4_;
              auVar58._0_4_ = auVar96._0_4_ * auVar112._0_4_;
              auVar58._8_4_ = auVar96._8_4_ * auVar112._8_4_;
              auVar58._12_4_ = auVar96._12_4_ * auVar112._12_4_;
              auVar58._16_4_ = auVar96._16_4_ * auVar112._16_4_;
              auVar58._20_4_ = auVar96._20_4_ * auVar112._20_4_;
              auVar58._24_4_ = auVar96._24_4_ * auVar112._24_4_;
              auVar58._28_4_ = auVar110._28_4_;
              auVar19 = vfmsub231ps_fma(auVar58,auVar95,auVar108);
              auVar59._4_4_ = auVar108._4_4_ * auVar107._4_4_;
              auVar59._0_4_ = auVar108._0_4_ * auVar107._0_4_;
              auVar59._8_4_ = auVar108._8_4_ * auVar107._8_4_;
              auVar59._12_4_ = auVar108._12_4_ * auVar107._12_4_;
              auVar59._16_4_ = auVar108._16_4_ * auVar107._16_4_;
              auVar59._20_4_ = auVar108._20_4_ * auVar107._20_4_;
              auVar59._24_4_ = auVar108._24_4_ * auVar107._24_4_;
              auVar59._28_4_ = auVar108._28_4_;
              auVar91 = vfmsub231ps_fma(auVar59,auVar106,auVar96);
              auVar60._4_4_ = auVar95._4_4_ * auVar106._4_4_;
              auVar60._0_4_ = auVar95._0_4_ * auVar106._0_4_;
              auVar60._8_4_ = auVar95._8_4_ * auVar106._8_4_;
              auVar60._12_4_ = auVar95._12_4_ * auVar106._12_4_;
              auVar60._16_4_ = auVar95._16_4_ * auVar106._16_4_;
              auVar60._20_4_ = auVar95._20_4_ * auVar106._20_4_;
              auVar60._24_4_ = auVar95._24_4_ * auVar106._24_4_;
              auVar60._28_4_ = auVar95._28_4_;
              auVar20 = vfmsub231ps_fma(auVar60,auVar107,auVar112);
              auVar90 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar91),ZEXT1632(auVar20));
              auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar19),auVar104);
              auVar112 = vrcp14ps_avx512vl(auVar110);
              auVar35._8_4_ = 0x3f800000;
              auVar35._0_8_ = &DAT_3f8000003f800000;
              auVar35._12_4_ = 0x3f800000;
              auVar35._16_4_ = 0x3f800000;
              auVar35._20_4_ = 0x3f800000;
              auVar35._24_4_ = 0x3f800000;
              auVar35._28_4_ = 0x3f800000;
              auVar108 = vfnmadd213ps_avx512vl(auVar112,auVar110,auVar35);
              auVar90 = vfmadd132ps_fma(auVar108,auVar112,auVar112);
              auVar61._4_4_ = auVar20._4_4_ * auVar126._4_4_;
              auVar61._0_4_ = auVar20._0_4_ * auVar126._0_4_;
              auVar61._8_4_ = auVar20._8_4_ * auVar126._8_4_;
              auVar61._12_4_ = auVar20._12_4_ * auVar126._12_4_;
              auVar61._16_4_ = fVar169 * 0.0;
              auVar61._20_4_ = fVar151 * 0.0;
              auVar61._24_4_ = fVar168 * 0.0;
              auVar61._28_4_ = iVar1;
              auVar91 = vfmadd231ps_fma(auVar61,auVar100,ZEXT1632(auVar91));
              auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar97,ZEXT1632(auVar19));
              fVar169 = auVar90._0_4_;
              fVar151 = auVar90._4_4_;
              fVar168 = auVar90._8_4_;
              fVar178 = auVar90._12_4_;
              auVar112 = ZEXT1632(CONCAT412(auVar91._12_4_ * fVar178,
                                            CONCAT48(auVar91._8_4_ * fVar168,
                                                     CONCAT44(auVar91._4_4_ * fVar151,
                                                              auVar91._0_4_ * fVar169))));
              auVar73._4_4_ = uStack_47c;
              auVar73._0_4_ = local_480;
              auVar73._8_4_ = uStack_478;
              auVar73._12_4_ = uStack_474;
              auVar73._16_4_ = uStack_470;
              auVar73._20_4_ = uStack_46c;
              auVar73._24_4_ = uStack_468;
              auVar73._28_4_ = uStack_464;
              uVar140 = vcmpps_avx512vl(auVar112,auVar73,0xd);
              uVar139 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar36._4_4_ = uVar139;
              auVar36._0_4_ = uVar139;
              auVar36._8_4_ = uVar139;
              auVar36._12_4_ = uVar139;
              auVar36._16_4_ = uVar139;
              auVar36._20_4_ = uVar139;
              auVar36._24_4_ = uVar139;
              auVar36._28_4_ = uVar139;
              uVar25 = vcmpps_avx512vl(auVar112,auVar36,2);
              local_370 = (byte)uVar140 & (byte)uVar25 & local_370;
              if (local_370 == 0) goto LAB_01c16c96;
              uVar140 = vcmpps_avx512vl(auVar110,auVar104,4);
              if ((local_370 & (byte)uVar140) == 0) {
                local_370 = 0;
              }
              else {
                local_370 = local_370 & (byte)uVar140;
                fVar179 = auVar98._0_4_ * fVar169;
                fVar180 = auVar98._4_4_ * fVar151;
                auVar62._4_4_ = fVar180;
                auVar62._0_4_ = fVar179;
                fVar161 = auVar98._8_4_ * fVar168;
                auVar62._8_4_ = fVar161;
                fVar167 = auVar98._12_4_ * fVar178;
                auVar62._12_4_ = fVar167;
                fVar84 = auVar98._16_4_ * 0.0;
                auVar62._16_4_ = fVar84;
                fVar85 = auVar98._20_4_ * 0.0;
                auVar62._20_4_ = fVar85;
                fVar132 = auVar98._24_4_ * 0.0;
                auVar62._24_4_ = fVar132;
                auVar62._28_4_ = auVar98._28_4_;
                fVar169 = auVar99._0_4_ * fVar169;
                fVar151 = auVar99._4_4_ * fVar151;
                auVar63._4_4_ = fVar151;
                auVar63._0_4_ = fVar169;
                fVar168 = auVar99._8_4_ * fVar168;
                auVar63._8_4_ = fVar168;
                fVar178 = auVar99._12_4_ * fVar178;
                auVar63._12_4_ = fVar178;
                fVar133 = auVar99._16_4_ * 0.0;
                auVar63._16_4_ = fVar133;
                fVar134 = auVar99._20_4_ * 0.0;
                auVar63._20_4_ = fVar134;
                fVar135 = auVar99._24_4_ * 0.0;
                auVar63._24_4_ = fVar135;
                auVar63._28_4_ = auVar99._28_4_;
                auVar188._8_4_ = 0x3f800000;
                auVar188._0_8_ = &DAT_3f8000003f800000;
                auVar188._12_4_ = 0x3f800000;
                auVar188._16_4_ = 0x3f800000;
                auVar188._20_4_ = 0x3f800000;
                auVar188._24_4_ = 0x3f800000;
                auVar188._28_4_ = 0x3f800000;
                auVar110 = vsubps_avx(auVar188,auVar62);
                local_640._0_4_ =
                     (uint)(bVar76 & 1) * (int)fVar179 | (uint)!(bool)(bVar76 & 1) * auVar110._0_4_;
                bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                local_640._4_4_ = (uint)bVar12 * (int)fVar180 | (uint)!bVar12 * auVar110._4_4_;
                bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
                local_640._8_4_ = (uint)bVar12 * (int)fVar161 | (uint)!bVar12 * auVar110._8_4_;
                bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
                local_640._12_4_ = (uint)bVar12 * (int)fVar167 | (uint)!bVar12 * auVar110._12_4_;
                bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
                local_640._16_4_ = (uint)bVar12 * (int)fVar84 | (uint)!bVar12 * auVar110._16_4_;
                bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
                local_640._20_4_ = (uint)bVar12 * (int)fVar85 | (uint)!bVar12 * auVar110._20_4_;
                bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
                local_640._24_4_ = (uint)bVar12 * (int)fVar132 | (uint)!bVar12 * auVar110._24_4_;
                bVar12 = SUB81(uVar74 >> 7,0);
                local_640._28_4_ = (uint)bVar12 * auVar98._28_4_ | (uint)!bVar12 * auVar110._28_4_;
                auVar110 = vsubps_avx(auVar188,auVar63);
                bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                bVar14 = (bool)((byte)(uVar74 >> 3) & 1);
                bVar15 = (bool)((byte)(uVar74 >> 4) & 1);
                bVar16 = (bool)((byte)(uVar74 >> 5) & 1);
                bVar17 = (bool)((byte)(uVar74 >> 6) & 1);
                bVar18 = SUB81(uVar74 >> 7,0);
                local_300._4_4_ = (uint)bVar12 * (int)fVar151 | (uint)!bVar12 * auVar110._4_4_;
                local_300._0_4_ =
                     (uint)(bVar76 & 1) * (int)fVar169 | (uint)!(bool)(bVar76 & 1) * auVar110._0_4_;
                local_300._8_4_ = (uint)bVar13 * (int)fVar168 | (uint)!bVar13 * auVar110._8_4_;
                local_300._12_4_ = (uint)bVar14 * (int)fVar178 | (uint)!bVar14 * auVar110._12_4_;
                local_300._16_4_ = (uint)bVar15 * (int)fVar133 | (uint)!bVar15 * auVar110._16_4_;
                local_300._20_4_ = (uint)bVar16 * (int)fVar134 | (uint)!bVar16 * auVar110._20_4_;
                local_300._24_4_ = (uint)bVar17 * (int)fVar135 | (uint)!bVar17 * auVar110._24_4_;
                local_300._28_4_ = (uint)bVar18 * auVar99._28_4_ | (uint)!bVar18 * auVar110._28_4_;
                local_660 = auVar112;
              }
            }
            auVar217 = ZEXT3264(local_700);
            auVar208 = ZEXT3264(local_6e0);
            if (local_370 != 0) {
              auVar110 = vsubps_avx(ZEXT1632(auVar89),auVar101);
              auVar90 = vfmadd213ps_fma(auVar110,local_640,auVar101);
              uVar139 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar37._4_4_ = uVar139;
              auVar37._0_4_ = uVar139;
              auVar37._8_4_ = uVar139;
              auVar37._12_4_ = uVar139;
              auVar37._16_4_ = uVar139;
              auVar37._20_4_ = uVar139;
              auVar37._24_4_ = uVar139;
              auVar37._28_4_ = uVar139;
              auVar110 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar90._12_4_ + auVar90._12_4_,
                                                            CONCAT48(auVar90._8_4_ + auVar90._8_4_,
                                                                     CONCAT44(auVar90._4_4_ +
                                                                              auVar90._4_4_,
                                                                              auVar90._0_4_ +
                                                                              auVar90._0_4_)))),
                                         auVar37);
              uVar140 = vcmpps_avx512vl(local_660,auVar110,6);
              local_370 = local_370 & (byte)uVar140;
              if (local_370 != 0) {
                auVar150._8_4_ = 0xbf800000;
                auVar150._0_8_ = 0xbf800000bf800000;
                auVar150._12_4_ = 0xbf800000;
                auVar150._16_4_ = 0xbf800000;
                auVar150._20_4_ = 0xbf800000;
                auVar150._24_4_ = 0xbf800000;
                auVar150._28_4_ = 0xbf800000;
                auVar38._8_4_ = 0x40000000;
                auVar38._0_8_ = 0x4000000040000000;
                auVar38._12_4_ = 0x40000000;
                auVar38._16_4_ = 0x40000000;
                auVar38._20_4_ = 0x40000000;
                auVar38._24_4_ = 0x40000000;
                auVar38._28_4_ = 0x40000000;
                local_400 = vfmadd132ps_avx512vl(local_300,auVar150,auVar38);
                local_300 = local_400;
                auVar110 = local_300;
                local_3c0 = (undefined4)lVar82;
                local_3b0 = local_750._0_8_;
                uStack_3a8 = local_750._8_8_;
                local_3a0 = local_510._0_8_;
                uStack_398 = local_510._8_8_;
                local_390 = local_520._0_8_;
                uStack_388 = local_520._8_8_;
                local_380 = local_530._0_8_;
                uStack_378 = local_530._8_8_;
                pGVar8 = (context->scene->geometries).items[uVar81].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar76 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar76 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_160 = vmovdqa64_avx512vl(auVar204._0_32_);
                  auVar90 = vcvtsi2ss_avx512f(auVar209._0_16_,local_3c0);
                  fVar169 = auVar90._0_4_;
                  local_360[0] = (fVar169 + local_640._0_4_ + 0.0) * (float)local_4a0;
                  local_360[1] = (fVar169 + local_640._4_4_ + 1.0) * local_4a0._4_4_;
                  local_360[2] = (fVar169 + local_640._8_4_ + 2.0) * fStack_498;
                  local_360[3] = (fVar169 + local_640._12_4_ + 3.0) * fStack_494;
                  fStack_350 = (fVar169 + local_640._16_4_ + 4.0) * fStack_490;
                  fStack_34c = (fVar169 + local_640._20_4_ + 5.0) * fStack_48c;
                  fStack_348 = (fVar169 + local_640._24_4_ + 6.0) * fStack_488;
                  fStack_344 = fVar169 + local_640._28_4_ + 7.0;
                  local_300._0_8_ = local_400._0_8_;
                  local_300._8_8_ = local_400._8_8_;
                  local_300._16_8_ = local_400._16_8_;
                  local_300._24_8_ = local_400._24_8_;
                  local_340 = local_300._0_8_;
                  uStack_338 = local_300._8_8_;
                  uStack_330 = local_300._16_8_;
                  uStack_328 = local_300._24_8_;
                  local_320 = local_660;
                  local_680 = local_510._0_8_;
                  uStack_678 = local_510._8_8_;
                  uVar74 = 0;
                  uVar77 = (ulong)local_370;
                  for (uVar79 = uVar77; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000
                      ) {
                    uVar74 = uVar74 + 1;
                  }
                  local_690 = local_520._0_4_;
                  fStack_68c = local_520._4_4_;
                  fStack_688 = local_520._8_4_;
                  fStack_684 = local_520._12_4_;
                  _local_770 = local_530;
                  local_4e0._0_4_ = 1;
                  local_420 = local_640;
                  local_3e0 = local_660;
                  local_3bc = iVar7;
                  local_300 = auVar110;
                  do {
                    local_760 = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_220 = local_360[uVar74];
                    local_200 = *(undefined4 *)((long)&local_340 + uVar74 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar74 * 4);
                    local_7a0.context = context->user;
                    fVar151 = 1.0 - local_220;
                    fVar169 = fVar151 * fVar151 * -3.0;
                    auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151)),
                                              ZEXT416((uint)(local_220 * fVar151)),
                                              ZEXT416(0xc0000000));
                    auVar89 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar151)),
                                              ZEXT416((uint)(local_220 * local_220)),
                                              ZEXT416(0x40000000));
                    fVar151 = auVar90._0_4_ * 3.0;
                    fVar168 = auVar89._0_4_ * 3.0;
                    fVar178 = local_220 * local_220 * 3.0;
                    auVar185._0_4_ = fVar178 * (float)local_770._0_4_;
                    auVar185._4_4_ = fVar178 * (float)local_770._4_4_;
                    auVar185._8_4_ = fVar178 * fStack_768;
                    auVar185._12_4_ = fVar178 * fStack_764;
                    auVar147._4_4_ = fVar168;
                    auVar147._0_4_ = fVar168;
                    auVar147._8_4_ = fVar168;
                    auVar147._12_4_ = fVar168;
                    auVar69._4_4_ = fStack_68c;
                    auVar69._0_4_ = local_690;
                    auVar69._8_4_ = fStack_688;
                    auVar69._12_4_ = fStack_684;
                    auVar90 = vfmadd132ps_fma(auVar147,auVar185,auVar69);
                    auVar165._4_4_ = fVar151;
                    auVar165._0_4_ = fVar151;
                    auVar165._8_4_ = fVar151;
                    auVar165._12_4_ = fVar151;
                    auVar71._8_8_ = uStack_678;
                    auVar71._0_8_ = local_680;
                    auVar90 = vfmadd132ps_fma(auVar165,auVar90,auVar71);
                    auVar148._4_4_ = fVar169;
                    auVar148._0_4_ = fVar169;
                    auVar148._8_4_ = fVar169;
                    auVar148._12_4_ = fVar169;
                    auVar90 = vfmadd132ps_fma(auVar148,auVar90,local_750);
                    local_280 = auVar90._0_4_;
                    auVar177._8_4_ = 1;
                    auVar177._0_8_ = 0x100000001;
                    auVar177._12_4_ = 1;
                    auVar177._16_4_ = 1;
                    auVar177._20_4_ = 1;
                    auVar177._24_4_ = 1;
                    auVar177._28_4_ = 1;
                    local_260 = vpermps_avx2(auVar177,ZEXT1632(auVar90));
                    auVar189._8_4_ = 2;
                    auVar189._0_8_ = 0x200000002;
                    auVar189._12_4_ = 2;
                    auVar189._16_4_ = 2;
                    auVar189._20_4_ = 2;
                    auVar189._24_4_ = 2;
                    auVar189._28_4_ = 2;
                    local_240 = vpermps_avx2(auVar189,ZEXT1632(auVar90));
                    uStack_27c = local_280;
                    uStack_278 = local_280;
                    uStack_274 = local_280;
                    uStack_270 = local_280;
                    uStack_26c = local_280;
                    uStack_268 = local_280;
                    uStack_264 = local_280;
                    fStack_21c = local_220;
                    fStack_218 = local_220;
                    fStack_214 = local_220;
                    fStack_210 = local_220;
                    fStack_20c = local_220;
                    fStack_208 = local_220;
                    fStack_204 = local_220;
                    uStack_1fc = local_200;
                    uStack_1f8 = local_200;
                    uStack_1f4 = local_200;
                    uStack_1f0 = local_200;
                    uStack_1ec = local_200;
                    uStack_1e8 = local_200;
                    uStack_1e4 = local_200;
                    local_1e0 = local_440._0_8_;
                    uStack_1d8 = local_440._8_8_;
                    uStack_1d0 = local_440._16_8_;
                    uStack_1c8 = local_440._24_8_;
                    local_1c0 = local_460;
                    vpcmpeqd_avx2(local_460,local_460);
                    local_1a0 = (local_7a0.context)->instID[0];
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_180 = (local_7a0.context)->instPrimID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_6c0 = local_2a0._0_8_;
                    uStack_6b8 = local_2a0._8_8_;
                    uStack_6b0 = local_2a0._16_8_;
                    uStack_6a8 = local_2a0._24_8_;
                    local_7a0.valid = (int *)&local_6c0;
                    local_7a0.geometryUserPtr = pGVar8->userPtr;
                    local_7a0.hit = (RTCHitN *)&local_280;
                    local_7a0.N = 8;
                    pRVar75 = (RayK<8> *)pGVar8->occlusionFilterN;
                    local_4c0._0_8_ = uVar74;
                    uVar79 = uVar74;
                    local_7a0.ray = (RTCRayN *)ray;
                    if (pRVar75 != (RayK<8> *)0x0) {
                      pRVar75 = (RayK<8> *)(*(code *)pRVar75)(&local_7a0);
                      uVar79 = local_4c0._0_8_;
                    }
                    auVar67._8_8_ = uStack_6b8;
                    auVar67._0_8_ = local_6c0;
                    auVar67._16_8_ = uStack_6b0;
                    auVar67._24_8_ = uStack_6a8;
                    if (auVar67 != (undefined1  [32])0x0) {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var11)(&local_7a0);
                        uVar79 = local_4c0._0_8_;
                      }
                      auVar90 = auVar213._0_16_;
                      auVar68._8_8_ = uStack_6b8;
                      auVar68._0_8_ = local_6c0;
                      auVar68._16_8_ = uStack_6b0;
                      auVar68._24_8_ = uStack_6a8;
                      uVar74 = vptestmd_avx512vl(auVar68,auVar68);
                      auVar110 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar12 = (bool)((byte)uVar74 & 1);
                      auVar131._0_4_ =
                           (uint)bVar12 * auVar110._0_4_ |
                           (uint)!bVar12 * *(int *)(local_7a0.ray + 0x100);
                      bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                      auVar131._4_4_ =
                           (uint)bVar12 * auVar110._4_4_ |
                           (uint)!bVar12 * *(int *)(local_7a0.ray + 0x104);
                      bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
                      auVar131._8_4_ =
                           (uint)bVar12 * auVar110._8_4_ |
                           (uint)!bVar12 * *(int *)(local_7a0.ray + 0x108);
                      bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
                      auVar131._12_4_ =
                           (uint)bVar12 * auVar110._12_4_ |
                           (uint)!bVar12 * *(int *)(local_7a0.ray + 0x10c);
                      bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
                      auVar131._16_4_ =
                           (uint)bVar12 * auVar110._16_4_ |
                           (uint)!bVar12 * *(int *)(local_7a0.ray + 0x110);
                      bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
                      auVar131._20_4_ =
                           (uint)bVar12 * auVar110._20_4_ |
                           (uint)!bVar12 * *(int *)(local_7a0.ray + 0x114);
                      bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
                      auVar131._24_4_ =
                           (uint)bVar12 * auVar110._24_4_ |
                           (uint)!bVar12 * *(int *)(local_7a0.ray + 0x118);
                      bVar12 = SUB81(uVar74 >> 7,0);
                      auVar131._28_4_ =
                           (uint)bVar12 * auVar110._28_4_ |
                           (uint)!bVar12 * *(int *)(local_7a0.ray + 0x11c);
                      *(undefined1 (*) [32])(local_7a0.ray + 0x100) = auVar131;
                      pRVar75 = (RayK<8> *)local_7a0.ray;
                      if (auVar68 != (undefined1  [32])0x0) break;
                    }
                    auVar90 = auVar213._0_16_;
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_760;
                    uVar74 = 0;
                    uVar77 = uVar77 ^ 1L << (uVar79 & 0x3f);
                    for (uVar79 = uVar77; (uVar79 & 1) == 0;
                        uVar79 = uVar79 >> 1 | 0x8000000000000000) {
                      uVar74 = uVar74 + 1;
                    }
                    local_4e0._0_4_ = (int)CONCAT71((int7)((ulong)pRVar75 >> 8),uVar77 != 0);
                  } while (uVar77 != 0);
                  bVar76 = local_4e0[0] & 1;
                  auVar90 = vxorps_avx512vl(auVar90,auVar90);
                  auVar213 = ZEXT1664(auVar90);
                  auVar210 = ZEXT3264(local_560);
                  auVar211 = ZEXT3264(local_500);
                  auVar212 = ZEXT3264(local_580);
                  auVar208 = ZEXT3264(local_6e0);
                  auVar217 = ZEXT3264(local_700);
                  auVar214 = ZEXT3264(local_5c0);
                  auVar215 = ZEXT3264(local_5e0);
                  auVar216 = ZEXT3264(local_600);
                  auVar110 = vmovdqa64_avx512vl(local_160);
                  auVar204 = ZEXT3264(auVar110);
                }
                bVar80 = (bool)(bVar80 | bVar76);
              }
            }
          }
          lVar82 = lVar82 + 8;
          auVar209 = auVar208;
        } while ((int)lVar82 < iVar7);
      }
      if (bVar80 != false) {
        return local_7d9;
      }
      uVar139 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar31._4_4_ = uVar139;
      auVar31._0_4_ = uVar139;
      auVar31._8_4_ = uVar139;
      auVar31._12_4_ = uVar139;
      uVar140 = vcmpps_avx512vl(local_2b0,auVar31,2);
      uVar81 = (uint)uVar83 & (uint)uVar83 + 0xf & (uint)uVar140;
      uVar83 = (ulong)uVar81;
      local_7d9 = uVar81 != 0;
    } while (local_7d9);
  }
  return local_7d9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }